

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

bool embree::avx512::InstanceArrayIntersector1MB::pointQuery
               (PointQuery *query,PointQueryContext *context,Primitive *prim)

{
  undefined8 *puVar1;
  Geometry *pGVar2;
  RTCPointQueryContext *pRVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  byte bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  Ref<embree::Geometry> *pRVar24;
  long *plVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  _func_int *p_Var29;
  bool bVar30;
  uint uVar31;
  uint uVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  vfloat4 a0_2;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 in_ZMM0 [64];
  float fVar114;
  int iVar115;
  vfloat4 a0;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 in_ZMM1 [64];
  float fVar138;
  vfloat4 a0_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 in_ZMM2 [64];
  undefined4 uVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 in_ZMM4 [64];
  float fVar174;
  vfloat4 b0;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 in_ZMM5 [64];
  float fVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 in_ZMM7 [64];
  vfloat4 a1;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined8 local_e8;
  undefined4 local_e0;
  float local_dc;
  float local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  _func_int *local_a8;
  undefined8 local_a0;
  PointQuery *local_98;
  int local_90;
  undefined1 local_88 [16];
  float local_78;
  void *local_70;
  undefined8 local_68;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  auVar39 = in_ZMM6._0_16_;
  auVar41 = in_ZMM7._0_16_;
  auVar43 = in_ZMM17._0_16_;
  aVar45 = in_ZMM4._0_16_;
  auVar35 = in_ZMM19._0_16_;
  auVar36 = in_ZMM20._0_16_;
  auVar37 = in_ZMM21._0_16_;
  auVar34 = in_ZMM18._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  b0.field_0 = in_ZMM5._0_16_;
  a0_2.field_0 = in_ZMM0._0_16_;
  auVar48 = in_ZMM16._0_16_;
  auVar44 = in_ZMM15._0_16_;
  auVar40 = in_ZMM14._0_16_;
  auVar38 = in_ZMM3._0_16_;
  a0_1.field_0 = in_ZMM2._0_16_;
  auVar42 = in_ZMM11._0_16_;
  uVar21 = (ulong)prim->primID_;
  pRVar24 = (context->scene->geometries).items;
  pGVar2 = pRVar24[prim->instID_].ptr;
  p_Var29 = *(_func_int **)&pGVar2->field_0x58;
  if (p_Var29 == (_func_int *)0x0) {
    pRVar24 = (Ref<embree::Geometry> *)
              (ulong)*(uint *)(*(long *)&pGVar2[1].time_range.upper +
                              (long)pGVar2[1].intersectionFilterN * uVar21);
    if (pRVar24 == (Ref<embree::Geometry> *)0xffffffff) {
      p_Var29 = (_func_int *)0x0;
    }
    else {
      p_Var29 = pGVar2[1].super_RefCount._vptr_RefCount[(long)pRVar24];
    }
  }
  if (p_Var29 == (_func_int *)0x0) {
    return false;
  }
  if (pGVar2->numTimeSteps == 1) {
    plVar25 = *(long **)&pGVar2[1].fnumTimeSegments;
    iVar115 = (int)plVar25[4];
    if ((pGVar2->field_8).field_0x1 == '\x01') {
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar28 = *plVar25;
          lVar22 = uVar21 * plVar25[2];
          auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x10 + lVar22)),0x1c);
          a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar28 + 0x20 + lVar22)),0x28);
          auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 4 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x14 + lVar22)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar28 + 0x24 + lVar22)),0x28);
          auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 8 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)),0x1c);
          auVar38 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar28 + 0x28 + lVar22)),0x28);
          auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x1c + lVar22)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar28 + 0x2c + lVar22)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar28 = *plVar25;
          lVar22 = uVar21 * plVar25[2];
          auVar122._8_8_ = 0;
          auVar122._0_8_ = *(ulong *)(lVar28 + 4 + lVar22);
          auVar159._8_8_ = 0;
          auVar159._0_8_ = *(ulong *)(lVar28 + 0x10 + lVar22);
          a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + lVar22)),
                                            (undefined1  [16])_DAT_02060e80,auVar122);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                            (undefined1  [16])_DAT_02060e80,auVar159);
          auVar123._8_8_ = 0;
          auVar123._0_8_ = *(ulong *)(lVar28 + 0x1c + lVar22);
          auVar38 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)),
                                       (undefined1  [16])_DAT_02060e80,auVar123);
          auVar184._8_8_ = 0;
          auVar184._0_8_ = *(ulong *)(lVar28 + 0x28 + lVar22);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0x24 + lVar22)),
                                          (undefined1  [16])_DAT_02060e80,auVar184);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar28 = *plVar25;
        lVar22 = uVar21 * plVar25[2];
        auVar100._8_8_ = 0;
        auVar100._0_8_ = *(ulong *)(lVar28 + 0x10 + lVar22);
        auVar35 = vinsertps_avx(auVar100,ZEXT416(*(uint *)(lVar28 + 8 + lVar22)),0x20);
        auVar101._8_8_ = 0;
        auVar101._0_8_ = *(ulong *)(lVar28 + 0x34 + lVar22);
        auVar37 = vpermt2ps_avx512vl(auVar101,_DAT_02060e90,ZEXT416(*(uint *)(lVar28 + lVar22)));
        auVar185._8_8_ = 0;
        auVar185._0_8_ = *(ulong *)(lVar28 + 0x1c + lVar22);
        fVar114 = *(float *)(lVar28 + 0x24 + lVar22);
        fVar77 = *(float *)(lVar28 + 0x28 + lVar22);
        fVar33 = *(float *)(lVar28 + 0x2c + lVar22);
        auVar38 = vpermt2ps_avx512vl(auVar185,_DAT_02060e90,
                                     ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)));
        fVar138 = *(float *)(lVar28 + 0x30 + lVar22);
        auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar77 * fVar77)),ZEXT416((uint)fVar114),
                                  ZEXT416((uint)fVar114));
        auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
        auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
        auVar41 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar36._0_4_));
        fVar174 = auVar41._0_4_;
        fVar174 = fVar174 * 1.5 + fVar174 * fVar174 * fVar174 * auVar36._0_4_ * -0.5;
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar38,ZEXT416((uint)(fVar174 * fVar114)),0x30);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar37,ZEXT416((uint)(fVar174 * fVar77)),0x30);
        auVar38 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar174 * fVar138)),0x30);
        auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                ZEXT416(*(uint *)(lVar28 + 4 + lVar22)),0x10);
        auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar28 + 0x3c + lVar22)),0x20);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar35,ZEXT416((uint)(fVar33 * fVar174)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar28 = *plVar25;
        lVar22 = uVar21 * plVar25[2];
        a0_2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar28 + lVar22))->v;
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar28 + 0x10 + lVar22))
                        ->v;
        auVar38 = *(undefined1 (*) [16])(lVar28 + 0x20 + lVar22);
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar28 + 0x30 + lVar22))->v
        ;
      }
      auVar35 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar36 = vshufps_avx((undefined1  [16])a0_2.field_0,(undefined1  [16])a0_2.field_0,0xff);
      auVar37 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar41 = vshufps_avx(auVar38,auVar38,0xff);
      auVar46 = vxorps_avx512vl(auVar34,auVar34);
      auVar34 = vshufps_avx512vl((undefined1  [16])a0_2.field_0,auVar46,0xe9);
      auVar34 = vblendps_avx(auVar34,(undefined1  [16])a0_1.field_0,4);
      fVar194 = auVar36._0_4_;
      auVar39 = vfmadd213ss_fma(auVar35,auVar35,ZEXT416((uint)(fVar194 * fVar194)));
      auVar39 = vfnmadd231ss_fma(auVar39,auVar37,auVar37);
      auVar40 = vfnmadd231ss_fma(auVar39,auVar41,auVar41);
      fVar174 = auVar35._0_4_;
      auVar44 = ZEXT416((uint)(auVar41._0_4_ * fVar174));
      auVar39 = vfmadd213ss_fma(auVar37,auVar36,auVar44);
      fVar114 = auVar39._0_4_ + auVar39._0_4_;
      auVar42 = ZEXT416((uint)(auVar37._0_4_ * fVar174));
      auVar39 = vfmsub213ss_fma(auVar41,auVar36,auVar42);
      fVar77 = auVar39._0_4_ + auVar39._0_4_;
      auVar39 = vfmsub231ss_fma(auVar44,auVar36,auVar37);
      fVar33 = auVar39._0_4_ + auVar39._0_4_;
      auVar39 = vfmsub231ss_fma(ZEXT416((uint)(fVar194 * fVar194)),auVar35,auVar35);
      auVar35 = vfmadd213ss_fma(auVar37,auVar37,auVar39);
      auVar44 = vfnmadd231ss_fma(auVar35,auVar41,auVar41);
      auVar35 = vfmadd213ss_avx512f(auVar41,auVar37,ZEXT416((uint)(fVar194 * fVar174)));
      auVar48 = vaddss_avx512f(auVar35,auVar35);
      auVar35 = vfmadd213ss_fma(auVar36,auVar41,auVar42);
      fVar138 = auVar35._0_4_ + auVar35._0_4_;
      auVar35 = vfmsub231ss_fma(ZEXT416((uint)(fVar194 * fVar174)),auVar37,auVar41);
      fVar174 = auVar35._0_4_ + auVar35._0_4_;
      auVar35 = vfnmadd231ss_fma(auVar39,auVar37,auVar37);
      auVar36 = vfmadd231ss_fma(auVar35,auVar41,auVar41);
      uVar154 = auVar40._0_4_;
      auVar200._4_4_ = uVar154;
      auVar200._0_4_ = uVar154;
      auVar200._8_4_ = uVar154;
      auVar200._12_4_ = uVar154;
      auVar208._4_4_ = fVar114;
      auVar208._0_4_ = fVar114;
      auVar208._8_4_ = fVar114;
      auVar208._12_4_ = fVar114;
      auVar222._0_4_ = fVar77 * 0.0;
      auVar222._4_4_ = fVar77 * 0.0;
      auVar222._8_4_ = fVar77 * 1.0;
      auVar222._12_4_ = fVar77 * 0.0;
      auVar37 = ZEXT816(0x3f80000000000000);
      auVar35 = vfmadd231ps_fma(auVar222,auVar37,auVar208);
      auVar41 = SUB6416(ZEXT464(0x3f800000),0);
      auVar40 = vfmadd231ps_fma(auVar35,auVar41,auVar200);
      auVar201._4_4_ = fVar33;
      auVar201._0_4_ = fVar33;
      auVar201._8_4_ = fVar33;
      auVar201._12_4_ = fVar33;
      uVar154 = auVar44._0_4_;
      auVar209._4_4_ = uVar154;
      auVar209._0_4_ = uVar154;
      auVar209._8_4_ = uVar154;
      auVar209._12_4_ = uVar154;
      auVar35 = vbroadcastss_avx512vl(auVar48);
      auVar221._0_4_ = auVar35._0_4_ * 0.0;
      auVar221._4_4_ = auVar35._4_4_ * 0.0;
      auVar221._8_4_ = auVar35._8_4_ * 1.0;
      auVar221._12_4_ = auVar35._12_4_ * 0.0;
      auVar35 = vfmadd231ps_fma(auVar221,auVar37,auVar209);
      auVar42 = vfmadd231ps_fma(auVar35,auVar41,auVar201);
      auVar39._4_4_ = fVar138;
      auVar39._0_4_ = fVar138;
      auVar39._8_4_ = fVar138;
      auVar39._12_4_ = fVar138;
      auVar186._4_4_ = fVar174;
      auVar186._0_4_ = fVar174;
      auVar186._8_4_ = fVar174;
      auVar186._12_4_ = fVar174;
      fVar114 = auVar36._0_4_;
      auVar202._0_4_ = fVar114 * 0.0;
      auVar202._4_4_ = fVar114 * 0.0;
      auVar202._8_4_ = fVar114 * 1.0;
      auVar202._12_4_ = fVar114 * 0.0;
      auVar35 = vfmadd231ps_fma(auVar202,auVar37,auVar186);
      auVar41 = vfmadd231ps_fma(auVar35,auVar41,auVar39);
      aVar45 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vaddps_avx512vl(auVar34,auVar46);
      auVar102._0_4_ = a0_2.field_0._0_4_;
      auVar102._4_4_ = auVar102._0_4_;
      auVar102._8_4_ = auVar102._0_4_;
      auVar102._12_4_ = auVar102._0_4_;
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmulps_avx512vl(auVar41,auVar46);
      auVar34 = vfmadd213ps_avx512vl(auVar46,auVar42,(undefined1  [16])b0.field_0);
      auVar34 = vfmadd231ps_avx512vl(auVar34,auVar40,auVar102);
      iVar115 = a0_1.field_0._0_4_;
      auVar103._4_4_ = iVar115;
      auVar103._0_4_ = iVar115;
      auVar103._8_4_ = iVar115;
      auVar103._12_4_ = iVar115;
      auVar35 = vshufps_avx512vl((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55)
      ;
      auVar35 = vfmadd213ps_avx512vl(auVar35,auVar42,(undefined1  [16])b0.field_0);
      auVar35 = vfmadd231ps_avx512vl(auVar35,auVar40,auVar103);
      uVar154 = auVar38._0_4_;
      auVar104._4_4_ = uVar154;
      auVar104._0_4_ = uVar154;
      auVar104._8_4_ = uVar154;
      auVar104._12_4_ = uVar154;
      auVar36 = vshufps_avx(auVar38,auVar38,0x55);
      auVar38 = vshufps_avx(auVar38,auVar38,0xaa);
      auVar37 = vmulps_avx512vl(auVar38,auVar41);
      auVar36 = vfmadd231ps_avx512vl(auVar37,auVar42,auVar36);
      auVar36 = vfmadd231ps_avx512vl(auVar36,auVar40,auVar104);
      iVar115 = a0.field_0._0_4_;
      a0_2.field_0.i[1] = iVar115;
      a0_2.field_0.i[0] = iVar115;
      a0_2.field_0.i[2] = iVar115;
      a0_2.field_0.i[3] = iVar115;
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0x55);
      auVar37 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xaa);
      auVar124._0_4_ = auVar37._0_4_ * auVar41._0_4_;
      auVar124._4_4_ = auVar37._4_4_ * auVar41._4_4_;
      auVar124._8_4_ = auVar37._8_4_ * auVar41._8_4_;
      auVar124._12_4_ = auVar37._12_4_ * auVar41._12_4_;
      auVar37 = vfmadd231ps_fma(auVar124,auVar42,(undefined1  [16])a0_1.field_0);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar37,auVar40,(undefined1  [16])a0_2.field_0);
      auVar37 = vaddps_avx512vl((undefined1  [16])aVar45,(undefined1  [16])a0.field_0);
    }
    else if (iVar115 < 0x9244) {
      if (iVar115 == 0x9134) {
        lVar28 = *plVar25;
        lVar22 = uVar21 * plVar25[2];
        uVar26 = *(uint *)(lVar28 + 4 + lVar22);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar26);
        uVar20 = *(uint *)(lVar28 + 8 + lVar22);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar20);
        uVar31 = *(uint *)(lVar28 + 0xc + lVar22);
        auVar38 = ZEXT416(uVar31);
        auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + lVar22)),
                                ZEXT416(*(uint *)(lVar28 + 0x10 + lVar22)),0x1c);
        auVar34 = vinsertps_avx512f(auVar34,ZEXT416(*(uint *)(lVar28 + 0x20 + lVar22)),0x28);
        auVar35 = vinsertps_avx(ZEXT416(uVar26),ZEXT416(*(uint *)(lVar28 + 0x14 + lVar22)),0x1c);
        auVar35 = vinsertps_avx512f(auVar35,ZEXT416(*(uint *)(lVar28 + 0x24 + lVar22)),0x28);
        auVar36 = vinsertps_avx(ZEXT416(uVar20),ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)),0x1c);
        auVar36 = vinsertps_avx512f(auVar36,ZEXT416(*(uint *)(lVar28 + 0x28 + lVar22)),0x28);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(ZEXT416(uVar31),ZEXT416(*(uint *)(lVar28 + 0x1c + lVar22)),0x1c
                                    );
        auVar37 = vinsertps_avx512f((undefined1  [16])a0_2.field_0,
                                    ZEXT416(*(uint *)(lVar28 + 0x2c + lVar22)),0x28);
      }
      else if (iVar115 == 0x9234) {
        lVar28 = *plVar25;
        lVar22 = uVar21 * plVar25[2];
        auVar78._8_8_ = 0;
        auVar78._0_8_ = *(ulong *)(lVar28 + 4 + lVar22);
        a0_1.field_0._8_8_ = 0;
        a0_1.field_0._0_8_ = *(ulong *)(lVar28 + 0x10 + lVar22);
        auVar34 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + lVar22)),
                                     (undefined1  [16])_DAT_02060e80,auVar78);
        auVar35 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                     (undefined1  [16])_DAT_02060e80,(undefined1  [16])a0_1.field_0)
        ;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = *(ulong *)(lVar28 + 0x1c + lVar22);
        auVar36 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)),
                                     (undefined1  [16])_DAT_02060e80,auVar79);
        a0_2.field_0._8_8_ = 0;
        a0_2.field_0._0_8_ = *(ulong *)(lVar28 + 0x28 + lVar22);
        auVar37 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0x24 + lVar22)),
                                     (undefined1  [16])_DAT_02060e80,(undefined1  [16])a0_2.field_0)
        ;
        a0.field_0 = _DAT_02060e80;
      }
    }
    else if (iVar115 == 0xb001) {
      lVar28 = *plVar25;
      lVar22 = uVar21 * plVar25[2];
      auVar82._8_8_ = 0;
      auVar82._0_8_ = *(ulong *)(lVar28 + 0x10 + lVar22);
      auVar35 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(lVar28 + 8 + lVar22)),0x20);
      auVar116._8_8_ = 0;
      auVar116._0_8_ = *(ulong *)(lVar28 + 0x34 + lVar22);
      uVar26 = *(uint *)(lVar28 + 0xc + lVar22);
      aVar45 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar26);
      auVar36 = vpermt2ps_avx512vl(auVar116,_DAT_02060e90,ZEXT416(*(uint *)(lVar28 + lVar22)));
      auVar175._8_8_ = 0;
      auVar175._0_8_ = *(ulong *)(lVar28 + 0x1c + lVar22);
      fVar114 = *(float *)(lVar28 + 0x24 + lVar22);
      fVar77 = *(float *)(lVar28 + 0x28 + lVar22);
      auVar41 = ZEXT416((uint)fVar77);
      fVar33 = *(float *)(lVar28 + 0x2c + lVar22);
      auVar37 = vpermt2ps_avx512vl(auVar175,_DAT_02060e90,ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22))
                                  );
      fVar138 = *(float *)(lVar28 + 0x30 + lVar22);
      auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar77 * fVar77)),ZEXT416((uint)fVar114),
                                ZEXT416((uint)fVar114));
      auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
      auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
      auVar38 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar34._0_4_));
      fVar174 = auVar38._0_4_;
      fVar174 = fVar174 * 1.5 + fVar174 * fVar174 * fVar174 * auVar34._0_4_ * -0.5;
      auVar38 = ZEXT416((uint)fVar174);
      auVar37 = vinsertps_avx512f(auVar37,ZEXT416((uint)(fVar114 * fVar174)),0x30);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar77 * fVar174));
      auVar34 = vinsertps_avx512f(auVar36,ZEXT416((uint)(fVar77 * fVar174)),0x30);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar33 * fVar174));
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     ZEXT416((uint)(fVar138 * fVar174));
      auVar36 = vinsertps_avx512f(auVar35,ZEXT416((uint)(fVar138 * fVar174)),0x30);
      auVar35 = vinsertps_avx(ZEXT416(uVar26),ZEXT416(*(uint *)(lVar28 + 4 + lVar22)),0x10);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar28 + 0x3c + lVar22)),0x20);
      auVar35 = vinsertps_avx512f((undefined1  [16])a0_2.field_0,ZEXT416((uint)(fVar33 * fVar174)),
                                  0x30);
      auVar39 = ZEXT416((uint)(fVar114 * fVar174));
    }
    else if (iVar115 == 0x9244) {
      lVar28 = *plVar25;
      lVar22 = uVar21 * plVar25[2];
      auVar34 = *(undefined1 (*) [16])(lVar28 + lVar22);
      auVar35 = *(undefined1 (*) [16])(lVar28 + 0x10 + lVar22);
      auVar36 = *(undefined1 (*) [16])(lVar28 + 0x20 + lVar22);
      auVar37 = *(undefined1 (*) [16])(lVar28 + 0x30 + lVar22);
    }
  }
  else {
    fVar114 = (pGVar2->time_range).lower;
    fVar77 = (pGVar2->time_range).upper;
    auVar38 = ZEXT416((uint)fVar77);
    fVar114 = pGVar2->fnumTimeSegments * ((query->time - fVar114) / (fVar77 - fVar114));
    auVar46 = ZEXT416((uint)fVar114);
    auVar42 = vroundss_avx(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),9);
    auVar42 = vminss_avx(auVar42,ZEXT416((uint)(pGVar2->fnumTimeSegments + -1.0)));
    a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(SUB6416(ZEXT864(0),0) << 0x20);
    a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vmaxss_avx(ZEXT816(0) << 0x20,auVar42);
    fVar114 = fVar114 - a0.field_0._0_4_;
    auVar42 = ZEXT416((uint)fVar114);
    auVar47 = ZEXT416((uint)fVar114);
    iVar23 = (int)a0.field_0._0_4_;
    lVar28 = *(long *)&pGVar2[1].fnumTimeSegments;
    lVar22 = CONCAT44((int)((ulong)pRVar24 >> 0x20),iVar23) * 0x38;
    plVar25 = (long *)(lVar28 + lVar22);
    iVar115 = *(int *)(lVar28 + 0x20 + lVar22);
    if ((pGVar2->field_8).field_0x1 == '\x01') {
      auVar38 = ZEXT416((uint)fVar114);
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar22 = *plVar25;
          lVar27 = plVar25[2] * uVar21;
          auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + lVar27)),
                                  ZEXT416(*(uint *)(lVar22 + 0x10 + lVar27)),0x1c);
          auVar40 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(lVar22 + 0x20 + lVar27)),0x28);
          auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 4 + lVar27)),
                                  ZEXT416(*(uint *)(lVar22 + 0x14 + lVar27)),0x1c);
          auVar47 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(lVar22 + 0x24 + lVar27)),0x28);
          auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 8 + lVar27)),
                                  ZEXT416(*(uint *)(lVar22 + 0x18 + lVar27)),0x1c);
          auVar48 = vinsertps_avx512f(auVar41,ZEXT416(*(uint *)(lVar22 + 0x28 + lVar27)),0x28);
          auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 0xc + lVar27)),
                                  ZEXT416(*(uint *)(lVar22 + 0x1c + lVar27)),0x1c);
          auVar44 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(lVar22 + 0x2c + lVar27)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar22 = *plVar25;
          lVar27 = plVar25[2] * uVar21;
          auVar48._8_8_ = 0;
          auVar48._0_8_ = *(ulong *)(lVar22 + 4 + lVar27);
          auVar47._8_8_ = 0;
          auVar47._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar27);
          auVar40 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,auVar48);
          auVar47 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0xc + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,auVar47);
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar27);
          auVar48 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x18 + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,auVar42);
          auVar59._8_8_ = 0;
          auVar59._0_8_ = *(ulong *)(lVar22 + 0x28 + lVar27);
          auVar44 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x24 + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,auVar59);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar22 = *plVar25;
        lVar27 = plVar25[2] * uVar21;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar27);
        auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(lVar22 + 8 + lVar27)),0x20);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)(lVar22 + 0x34 + lVar27);
        auVar40 = vpermt2ps_avx512vl(auVar40,_DAT_02060e90,ZEXT416(*(uint *)(lVar22 + lVar27)));
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar27);
        fVar77 = *(float *)(lVar22 + 0x24 + lVar27);
        fVar33 = *(float *)(lVar22 + 0x28 + lVar27);
        fVar138 = *(float *)(lVar22 + 0x2c + lVar27);
        auVar44 = vpermt2ps_avx512vl(auVar44,_DAT_02060e90,
                                     ZEXT416(*(uint *)(lVar22 + 0x18 + lVar27)));
        fVar174 = *(float *)(lVar22 + 0x30 + lVar27);
        auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),ZEXT416((uint)fVar77),
                                  ZEXT416((uint)fVar77));
        auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
        auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar174),ZEXT416((uint)fVar174));
        auVar48 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar39._0_4_));
        fVar194 = auVar48._0_4_;
        fVar194 = fVar194 * 1.5 + fVar194 * fVar194 * fVar194 * auVar39._0_4_ * -0.5;
        auVar44 = vinsertps_avx(auVar44,ZEXT416((uint)(fVar77 * fVar194)),0x30);
        auVar40 = vinsertps_avx(auVar40,ZEXT416((uint)(fVar33 * fVar194)),0x30);
        auVar48 = vinsertps_avx512f(auVar41,ZEXT416((uint)(fVar174 * fVar194)),0x30);
        auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 0xc + lVar27)),
                                ZEXT416(*(uint *)(lVar22 + 4 + lVar27)),0x10);
        auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(lVar22 + 0x3c + lVar27)),0x20);
        auVar47 = vinsertps_avx(auVar41,ZEXT416((uint)(fVar138 * fVar194)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar22 = *plVar25;
        lVar27 = plVar25[2] * uVar21;
        auVar40 = *(undefined1 (*) [16])(lVar22 + lVar27);
        auVar47 = *(undefined1 (*) [16])(lVar22 + 0x10 + lVar27);
        auVar48 = *(undefined1 (*) [16])(lVar22 + 0x20 + lVar27);
        auVar44 = *(undefined1 (*) [16])(lVar22 + 0x30 + lVar27);
      }
      lVar22 = (ulong)(iVar23 + 1) * 0x38;
      plVar25 = (long *)(lVar28 + lVar22);
      iVar115 = *(int *)(lVar28 + 0x20 + lVar22);
      lVar28 = 0;
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar28 = *plVar25;
          lVar22 = uVar21 * plVar25[2];
          auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x10 + lVar22)),0x1c);
          auVar43 = vinsertps_avx512f(auVar35,ZEXT416(*(uint *)(lVar28 + 0x20 + lVar22)),0x28);
          auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 4 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x14 + lVar22)),0x1c);
          auVar35 = vinsertps_avx512f(auVar35,ZEXT416(*(uint *)(lVar28 + 0x24 + lVar22)),0x28);
          auVar36 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 8 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)),0x1c);
          auVar36 = vinsertps_avx512f(auVar36,ZEXT416(*(uint *)(lVar28 + 0x28 + lVar22)),0x28);
          auVar37 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x1c + lVar22)),0x1c);
          auVar37 = vinsertps_avx512f(auVar37,ZEXT416(*(uint *)(lVar28 + 0x2c + lVar22)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar28 = *plVar25;
          lVar22 = uVar21 * plVar25[2];
          auVar60._8_8_ = 0;
          auVar60._0_8_ = *(ulong *)(lVar28 + 4 + lVar22);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = *(ulong *)(lVar28 + 0x10 + lVar22);
          auVar43 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + lVar22)),
                                       (undefined1  [16])_DAT_02060e80,auVar60);
          auVar35 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                       (undefined1  [16])_DAT_02060e80,auVar58);
          auVar56._8_8_ = 0;
          auVar56._0_8_ = *(ulong *)(lVar28 + 0x1c + lVar22);
          auVar36 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)),
                                       (undefined1  [16])_DAT_02060e80,auVar56);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = *(ulong *)(lVar28 + 0x28 + lVar22);
          auVar37 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0x24 + lVar22)),
                                       (undefined1  [16])_DAT_02060e80,auVar57);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar28 = *plVar25;
        lVar22 = uVar21 * plVar25[2];
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)(lVar28 + 0x10 + lVar22);
        auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar28 + 8 + lVar22)),0x20);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)(lVar28 + 0x34 + lVar22);
        auVar41 = vpermt2ps_avx512vl(auVar36,_DAT_02060e90,ZEXT416(*(uint *)(lVar28 + lVar22)));
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)(lVar28 + 0x1c + lVar22);
        fVar77 = *(float *)(lVar28 + 0x24 + lVar22);
        fVar33 = *(float *)(lVar28 + 0x28 + lVar22);
        fVar138 = *(float *)(lVar28 + 0x2c + lVar22);
        auVar37 = vpermt2ps_avx512vl(auVar37,_DAT_02060e90,
                                     ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)));
        fVar174 = *(float *)(lVar28 + 0x30 + lVar22);
        auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),ZEXT416((uint)fVar77),
                                  ZEXT416((uint)fVar77));
        auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
        auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar174),ZEXT416((uint)fVar174));
        auVar43._4_12_ = ZEXT812(0) << 0x20;
        auVar43._0_4_ = auVar36._0_4_;
        auVar39 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar43);
        fVar194 = auVar39._0_4_;
        fVar194 = fVar194 * 1.5 + fVar194 * fVar194 * fVar194 * auVar36._0_4_ * -0.5;
        auVar37 = vinsertps_avx512f(auVar37,ZEXT416((uint)(fVar77 * fVar194)),0x30);
        auVar43 = vinsertps_avx512f(auVar41,ZEXT416((uint)(fVar33 * fVar194)),0x30);
        auVar36 = vinsertps_avx512f(auVar35,ZEXT416((uint)(fVar174 * fVar194)),0x30);
        auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                ZEXT416(*(uint *)(lVar28 + 4 + lVar22)),0x10);
        auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar28 + 0x3c + lVar22)),0x20);
        auVar35 = vinsertps_avx512f(auVar35,ZEXT416((uint)(fVar138 * fVar194)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar28 = *plVar25;
        lVar22 = uVar21 * plVar25[2];
        auVar43 = *(undefined1 (*) [16])(lVar28 + lVar22);
        auVar35 = *(undefined1 (*) [16])(lVar28 + 0x10 + lVar22);
        auVar36 = *(undefined1 (*) [16])(lVar28 + 0x20 + lVar22);
        auVar37 = *(undefined1 (*) [16])(lVar28 + 0x30 + lVar22);
      }
      auVar42 = vshufps_avx512vl(auVar44,auVar44,0xff);
      auVar46 = vshufps_avx512vl(auVar40,auVar40,0xff);
      auVar41 = vshufps_avx(auVar47,auVar47,0xff);
      auVar59 = vshufps_avx512vl(auVar48,auVar48,0xff);
      auVar39 = vshufps_avx512vl(auVar37,auVar37,0xff);
      auVar60 = vshufps_avx512vl(auVar43,auVar43,0xff);
      auVar56 = vshufps_avx512vl(auVar35,auVar35,0xff);
      auVar57 = vshufps_avx512vl(auVar36,auVar36,0xff);
      auVar58 = vmulss_avx512f(auVar46,auVar60);
      auVar58 = vfmadd231ss_avx512f(auVar58,auVar39,auVar42);
      auVar58 = vfmadd231ss_avx512f(auVar58,auVar56,auVar41);
      auVar58 = vfmadd231ss_avx512f(auVar58,auVar57,auVar59);
      auVar64._8_4_ = 0x80000000;
      auVar64._0_8_ = 0x8000000080000000;
      auVar64._12_4_ = 0x80000000;
      auVar67._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
      auVar67._8_4_ = auVar58._8_4_ ^ 0x80000000;
      auVar67._12_4_ = auVar58._12_4_ ^ 0x80000000;
      bVar30 = auVar58._0_4_ < -auVar58._0_4_;
      auVar61 = vxorps_avx512vl(auVar39,auVar64);
      auVar62 = vxorps_avx512vl(auVar60,auVar64);
      auVar63 = vxorps_avx512vl(auVar56,auVar64);
      auVar64 = vxorps_avx512vl(auVar57,auVar64);
      auVar65._4_12_ = auVar39._4_12_;
      auVar65._0_4_ = (uint)bVar30 * auVar61._0_4_ + (uint)!bVar30 * auVar39._0_4_;
      auVar66._4_12_ = auVar60._4_12_;
      auVar66._0_4_ = (uint)bVar30 * auVar62._0_4_ + (uint)!bVar30 * auVar60._0_4_;
      auVar62._4_12_ = auVar56._4_12_;
      auVar62._0_4_ = (uint)bVar30 * auVar63._0_4_ + (uint)!bVar30 * auVar56._0_4_;
      auVar63._4_12_ = auVar57._4_12_;
      auVar63._0_4_ = (uint)bVar30 * auVar64._0_4_ + (uint)!bVar30 * auVar57._0_4_;
      auVar61._8_4_ = 0x7fffffff;
      auVar61._0_8_ = 0x7fffffff7fffffff;
      auVar61._12_4_ = 0x7fffffff;
      auVar60 = vandps_avx512vl(auVar58,auVar61);
      auVar39 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar60,ZEXT416(0x3c9df1b8));
      auVar39 = vfmadd213ss_fma(auVar39,auVar60,ZEXT416(0xbd37e81c));
      auVar39 = vfmadd213ss_fma(auVar39,auVar60,ZEXT416(0x3db3edac));
      auVar39 = vfmadd213ss_fma(auVar39,auVar60,ZEXT416(0xbe5ba881));
      auVar39 = vfmadd213ss_fma(auVar39,auVar60,ZEXT416(0x3fc90fd1));
      auVar56 = vmaxss_avx512f(auVar67,auVar58);
      auVar57 = vsubss_avx512f(ZEXT416(0x3f800000),auVar60);
      auVar58 = ZEXT816(0) << 0x20;
      if (auVar57._0_4_ < 0.0) {
        fVar77 = sqrtf(auVar57._0_4_);
        auVar58 = ZEXT816(0) << 0x40;
        auVar56 = ZEXT416(auVar56._0_4_);
      }
      else {
        auVar57 = vsqrtss_avx(auVar57,auVar57);
        fVar77 = auVar57._0_4_;
      }
      auVar39 = vmaxss_avx(auVar58,ZEXT416((uint)(1.5707964 - fVar77 * auVar39._0_4_)));
      uVar7 = vcmpss_avx512f(auVar56,auVar58,1);
      bVar30 = (bool)((byte)uVar7 & 1);
      auVar67 = ZEXT416(0x3f800000);
      uVar7 = vcmpss_avx512f(auVar67,auVar60,1);
      bVar9 = (bool)((byte)uVar7 & 1);
      fVar77 = fVar114 * (float)((uint)bVar9 * 0x7fc00000 +
                                (uint)!bVar9 *
                                (int)(1.5707964 -
                                     (float)((uint)bVar30 * (auVar39._0_4_ ^ 0x80000000) +
                                            (uint)!bVar30 * auVar39._0_4_)));
      auVar39 = ZEXT416((uint)(fVar77 * 0.63661975));
      auVar39 = vroundss_avx(auVar39,auVar39,9);
      auVar60 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar39,ZEXT416((uint)fVar77));
      uVar26 = (int)auVar39._0_4_ & 3;
      bVar30 = 1 < uVar26;
      plVar25 = (long *)CONCAT71((int7)((ulong)lVar28 >> 8),bVar30);
      uVar26 = uVar26 - 1;
      fVar33 = auVar60._0_4_;
      fVar77 = fVar33 * fVar33;
      auVar60 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar77),
                                ZEXT416(0x363938a8));
      auVar57 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar77),
                                ZEXT416(0x37cfab9c));
      auVar58 = ZEXT416((uint)fVar77);
      auVar60 = vfmadd213ss_fma(auVar60,auVar58,ZEXT416(0xb9501096));
      auVar57 = vfmadd213ss_fma(auVar57,auVar58,ZEXT416(0xbab60981));
      auVar60 = vfmadd213ss_fma(auVar60,auVar58,ZEXT416(0x3c088898));
      auVar57 = vfmadd213ss_fma(auVar57,auVar58,ZEXT416(0x3d2aaaa4));
      auVar58 = ZEXT416((uint)fVar77);
      auVar60 = vfmadd213ss_fma(auVar60,auVar58,ZEXT416(0xbe2aaaab));
      auVar57 = vfmadd213ss_fma(auVar57,auVar58,SUB6416(ZEXT464(0xbf000000),0));
      auVar60 = vfmadd213ss_avx512f(auVar60,auVar58,auVar67);
      auVar57 = vfmadd213ss_avx512f(auVar57,auVar58,auVar67);
      fVar33 = fVar33 * auVar60._0_4_;
      bVar8 = (byte)(int)auVar39._0_4_;
      uVar20 = (uint)(bVar8 & 1) * auVar57._0_4_ + (uint)!(bool)(bVar8 & 1) * (int)fVar33;
      auVar49._4_12_ = auVar57._4_12_;
      uVar31 = (uint)(bVar8 & 1) * (int)fVar33 + (uint)!(bool)(bVar8 & 1) * auVar57._0_4_;
      fVar33 = (float)((uint)bVar30 * (uVar20 ^ 0x80000000) + !bVar30 * uVar20);
      auVar49._0_4_ = (uint)(uVar26 < 2) * (uVar31 ^ 0x80000000) + (uVar26 >= 2) * uVar31;
      auVar60 = vfmsub213ss_avx512f(auVar42,auVar56,auVar65);
      auVar39 = vfmsub213ss_avx512f(auVar46,auVar56,auVar66);
      auVar57 = vfmsub213ss_avx512f(auVar41,auVar56,auVar62);
      auVar56 = vfmsub213ss_avx512f(auVar59,auVar56,auVar63);
      fVar138 = auVar39._0_4_;
      auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138)),auVar60,auVar60);
      auVar39 = vfmadd231ss_fma(auVar39,auVar57,auVar57);
      auVar39 = vfmadd231ss_fma(auVar39,auVar56,auVar56);
      auVar58 = vxorps_avx512vl(auVar34,auVar34);
      auVar50._4_12_ = auVar58._4_12_;
      auVar50._0_4_ = auVar39._0_4_;
      auVar34 = vrsqrt14ss_avx512f(auVar58,auVar50);
      fVar77 = auVar34._0_4_;
      fVar77 = fVar77 * 1.5 + fVar77 * fVar77 * fVar77 * auVar39._0_4_ * -0.5;
      auVar61 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar60._0_4_ * fVar77 * fVar33)),auVar49,auVar42
                                   );
      auVar64 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar138 * fVar77 * fVar33)),auVar49,auVar46);
      auVar39 = vfmsub231ss_fma(ZEXT416((uint)(auVar57._0_4_ * fVar77 * fVar33)),auVar49,auVar41);
      auVar60 = vfmsub231ss_fma(ZEXT416((uint)(auVar56._0_4_ * fVar77 * fVar33)),auVar59,auVar49);
      auVar56 = vsubss_avx512f(auVar67,auVar38);
      auVar34 = vmulss_avx512f(auVar38,auVar65);
      auVar42 = vfmadd231ss_avx512f(auVar34,auVar56,auVar42);
      auVar34 = vmulss_avx512f(auVar38,auVar66);
      auVar46 = vfmadd231ss_avx512f(auVar34,auVar56,auVar46);
      auVar34 = vmulss_avx512f(auVar38,auVar62);
      auVar34 = vfmadd231ss_fma(auVar34,auVar56,auVar41);
      auVar38 = vmulss_avx512f(auVar38,auVar63);
      auVar38 = vfmadd231ss_fma(auVar38,auVar56,auVar59);
      fVar33 = auVar46._0_4_;
      auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),auVar42,auVar42);
      auVar41 = vfmadd231ss_fma(auVar41,auVar34,auVar34);
      auVar41 = vfmadd231ss_fma(auVar41,auVar38,auVar38);
      auVar51._4_12_ = auVar50._4_12_;
      auVar51._0_4_ = auVar41._0_4_;
      auVar46 = vrsqrt14ss_avx512f(auVar58,auVar51);
      fVar77 = auVar46._0_4_;
      fVar77 = fVar77 * 1.5 + fVar77 * fVar77 * fVar77 * auVar41._0_4_ * -0.5;
      vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
      bVar30 = 2 < uVar26;
      auVar52._4_12_ = auVar61._4_12_;
      auVar52._0_4_ =
           (float)((uint)bVar30 * (int)(auVar42._0_4_ * fVar77) + (uint)!bVar30 * auVar61._0_4_);
      auVar53._4_12_ = auVar64._4_12_;
      auVar53._0_4_ = (float)((uint)bVar30 * (int)(fVar33 * fVar77) + (uint)!bVar30 * auVar64._0_4_)
      ;
      auVar54._4_12_ = auVar39._4_12_;
      auVar54._0_4_ =
           (float)((uint)bVar30 * (int)(auVar34._0_4_ * fVar77) + (uint)!bVar30 * auVar39._0_4_);
      auVar55._4_12_ = auVar60._4_12_;
      auVar55._0_4_ =
           (float)((uint)bVar30 * (int)(auVar38._0_4_ * fVar77) + (uint)!bVar30 * auVar60._0_4_);
      auVar173._4_4_ = fVar114;
      auVar173._0_4_ = fVar114;
      auVar173._8_4_ = fVar114;
      auVar173._12_4_ = fVar114;
      auVar34 = vmulps_avx512vl(auVar173,auVar43);
      auVar189._0_4_ = auVar56._0_4_;
      auVar189._4_4_ = auVar189._0_4_;
      auVar189._8_4_ = auVar189._0_4_;
      auVar189._12_4_ = auVar189._0_4_;
      auVar38 = vfmadd213ps_fma(auVar40,auVar189,auVar34);
      auVar34 = vmulps_avx512vl(auVar173,auVar35);
      auVar35 = vfmadd213ps_fma(auVar47,auVar189,auVar34);
      auVar34 = vmulps_avx512vl(auVar173,auVar36);
      auVar48 = vfmadd213ps_avx512vl(auVar48,auVar189,auVar34);
      auVar34 = vmulps_avx512vl(auVar173,auVar37);
      auVar37 = vfmadd213ps_fma(auVar44,auVar189,auVar34);
      auVar34 = vshufps_avx512vl(auVar38,auVar58,0xe9);
      auVar34 = vblendps_avx(auVar34,auVar35,4);
      auVar36 = vfmadd213ss_fma(auVar52,auVar52,ZEXT416((uint)(auVar53._0_4_ * auVar53._0_4_)));
      auVar36 = vfnmadd231ss_fma(auVar36,auVar54,auVar54);
      auVar39 = vfnmadd231ss_fma(auVar36,auVar55,auVar55);
      auVar36 = vfmadd213ss_fma(auVar54,auVar53,ZEXT416((uint)(auVar52._0_4_ * auVar55._0_4_)));
      fVar114 = auVar36._0_4_ + auVar36._0_4_;
      auVar36 = vfmsub213ss_fma(auVar55,auVar53,ZEXT416((uint)(auVar52._0_4_ * auVar54._0_4_)));
      fVar77 = auVar36._0_4_ + auVar36._0_4_;
      auVar36 = vfmsub231ss_fma(ZEXT416((uint)(auVar52._0_4_ * auVar55._0_4_)),auVar53,auVar54);
      fVar33 = auVar36._0_4_ + auVar36._0_4_;
      auVar41 = vfmsub231ss_fma(ZEXT416((uint)(auVar53._0_4_ * auVar53._0_4_)),auVar52,auVar52);
      auVar36 = vfmadd213ss_fma(auVar54,auVar54,auVar41);
      auVar42 = vfnmadd231ss_fma(auVar36,auVar55,auVar55);
      auVar36 = vfmadd213ss_fma(auVar55,auVar54,ZEXT416((uint)(auVar52._0_4_ * auVar53._0_4_)));
      fVar138 = auVar36._0_4_ + auVar36._0_4_;
      auVar36 = vfmadd213ss_fma(auVar53,auVar55,ZEXT416((uint)(auVar52._0_4_ * auVar54._0_4_)));
      fVar174 = auVar36._0_4_ + auVar36._0_4_;
      auVar36 = vfmsub231ss_fma(ZEXT416((uint)(auVar52._0_4_ * auVar53._0_4_)),auVar54,auVar55);
      fVar194 = auVar36._0_4_ + auVar36._0_4_;
      auVar36 = vfnmadd231ss_fma(auVar41,auVar54,auVar54);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ss_fma(auVar36,auVar55,auVar55);
      uVar154 = auVar39._0_4_;
      auVar110._4_4_ = uVar154;
      auVar110._0_4_ = uVar154;
      auVar110._8_4_ = uVar154;
      auVar110._12_4_ = uVar154;
      auVar128._4_4_ = fVar114;
      auVar128._0_4_ = fVar114;
      auVar128._8_4_ = fVar114;
      auVar128._12_4_ = fVar114;
      fVar114 = (float)DAT_01fec700;
      auVar213._0_4_ = fVar77 * fVar114;
      fVar4 = DAT_01fec700._4_4_;
      auVar213._4_4_ = fVar77 * fVar4;
      fVar5 = DAT_01fec700._8_4_;
      auVar213._8_4_ = fVar77 * fVar5;
      fVar6 = DAT_01fec700._12_4_;
      auVar213._12_4_ = fVar77 * fVar6;
      auVar40 = ZEXT816(0x3f80000000000000);
      auVar36 = vfmadd231ps_fma(auVar213,auVar40,auVar128);
      auVar44 = SUB6416(ZEXT464(0x3f800000),0);
      auVar39 = vfmadd231ps_fma(auVar36,auVar44,auVar110);
      auVar111._4_4_ = fVar33;
      auVar111._0_4_ = fVar33;
      auVar111._8_4_ = fVar33;
      auVar111._12_4_ = fVar33;
      uVar154 = auVar42._0_4_;
      auVar129._4_4_ = uVar154;
      auVar129._0_4_ = uVar154;
      auVar129._8_4_ = uVar154;
      auVar129._12_4_ = uVar154;
      auVar205._0_4_ = fVar138 * fVar114;
      auVar205._4_4_ = fVar138 * fVar4;
      auVar205._8_4_ = fVar138 * fVar5;
      auVar205._12_4_ = fVar138 * fVar6;
      auVar36 = vfmadd231ps_fma(auVar205,auVar40,auVar129);
      auVar41 = vfmadd231ps_fma(auVar36,auVar44,auVar111);
      auVar112._4_4_ = fVar174;
      auVar112._0_4_ = fVar174;
      auVar112._8_4_ = fVar174;
      auVar112._12_4_ = fVar174;
      auVar130._4_4_ = fVar194;
      auVar130._0_4_ = fVar194;
      auVar130._8_4_ = fVar194;
      auVar130._12_4_ = fVar194;
      fVar77 = b0.field_0._0_4_;
      auVar147._0_4_ = fVar77 * fVar114;
      auVar147._4_4_ = fVar77 * fVar4;
      auVar147._8_4_ = fVar77 * fVar5;
      auVar147._12_4_ = fVar77 * fVar6;
      auVar36 = vfmadd231ps_fma(auVar147,auVar40,auVar130);
      auVar40 = vfmadd231ps_fma(auVar36,auVar44,auVar112);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vaddps_avx512vl(auVar34,auVar58)
      ;
      uVar154 = auVar38._0_4_;
      auVar131._4_4_ = uVar154;
      auVar131._0_4_ = uVar154;
      auVar131._8_4_ = uVar154;
      auVar131._12_4_ = uVar154;
      auVar36 = vmulps_avx512vl(auVar40,auVar58);
      auVar34 = vfmadd213ps_avx512vl(auVar58,auVar41,auVar36);
      auVar34 = vfmadd231ps_avx512vl(auVar34,auVar39,auVar131);
      uVar154 = auVar35._0_4_;
      auVar132._4_4_ = uVar154;
      auVar132._0_4_ = uVar154;
      auVar132._8_4_ = uVar154;
      auVar132._12_4_ = uVar154;
      auVar35 = vshufps_avx512vl(auVar35,auVar35,0x55);
      auVar35 = vfmadd213ps_avx512vl(auVar35,auVar41,auVar36);
      auVar35 = vfmadd231ps_avx512vl(auVar35,auVar39,auVar132);
      auVar36 = vbroadcastss_avx512vl(auVar48);
      auVar38 = vshufps_avx512vl(auVar48,auVar48,0x55);
      auVar44 = vshufps_avx512vl(auVar48,auVar48,0xaa);
      auVar44 = vmulps_avx512vl(auVar44,auVar40);
      auVar38 = vfmadd231ps_avx512vl(auVar44,auVar41,auVar38);
      auVar36 = vfmadd231ps_avx512vl(auVar38,auVar39,auVar36);
      uVar154 = auVar37._0_4_;
      a0.field_0.i[1] = uVar154;
      a0.field_0.i[0] = uVar154;
      a0.field_0.i[2] = uVar154;
      a0.field_0.i[3] = uVar154;
      auVar38 = vshufps_avx(auVar37,auVar37,0x55);
      aVar45 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar37,auVar37,0xaa);
      auVar148._0_4_ = aVar45.v[0] * auVar40._0_4_;
      auVar148._4_4_ = aVar45.v[1] * auVar40._4_4_;
      auVar148._8_4_ = aVar45.v[2] * auVar40._8_4_;
      auVar148._12_4_ = aVar45.v[3] * auVar40._12_4_;
      auVar37 = vfmadd231ps_fma(auVar148,auVar41,auVar38);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar37,auVar39,(undefined1  [16])a0.field_0);
      auVar37 = vaddps_avx512vl((undefined1  [16])a0_2.field_0,(undefined1  [16])a0_1.field_0);
      auVar39 = _DAT_01fec700;
    }
    else {
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar22 = *plVar25;
          lVar27 = plVar25[2] * uVar21;
          uVar26 = *(uint *)(lVar22 + 4 + lVar27);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar26);
          uVar20 = *(uint *)(lVar22 + 8 + lVar27);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar20);
          uVar31 = *(uint *)(lVar22 + 0xc + lVar27);
          auVar38 = ZEXT416(uVar31);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + lVar27)),
                                  ZEXT416(*(uint *)(lVar22 + 0x10 + lVar27)),0x1c);
          auVar34 = vinsertps_avx512f(auVar34,ZEXT416(*(uint *)(lVar22 + 0x20 + lVar27)),0x28);
          auVar35 = vinsertps_avx(ZEXT416(uVar26),ZEXT416(*(uint *)(lVar22 + 0x14 + lVar27)),0x1c);
          auVar35 = vinsertps_avx512f(auVar35,ZEXT416(*(uint *)(lVar22 + 0x24 + lVar27)),0x28);
          auVar36 = vinsertps_avx(ZEXT416(uVar20),ZEXT416(*(uint *)(lVar22 + 0x18 + lVar27)),0x1c);
          auVar36 = vinsertps_avx512f(auVar36,ZEXT416(*(uint *)(lVar22 + 0x28 + lVar27)),0x28);
          auVar46 = vinsertps_avx(ZEXT416(uVar31),ZEXT416(*(uint *)(lVar22 + 0x1c + lVar27)),0x1c);
          auVar37 = vinsertps_avx512f(auVar46,ZEXT416(*(uint *)(lVar22 + 0x2c + lVar27)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar22 = *plVar25;
          lVar27 = plVar25[2] * uVar21;
          auVar80._8_8_ = 0;
          auVar80._0_8_ = *(ulong *)(lVar22 + 4 + lVar27);
          a0_1.field_0._8_8_ = 0;
          a0_1.field_0._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar27);
          auVar34 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,auVar80);
          auVar35 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0xc + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,
                                       (undefined1  [16])a0_1.field_0);
          auVar81._8_8_ = 0;
          auVar81._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar27);
          auVar36 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x18 + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,auVar81);
          auVar46._8_8_ = 0;
          auVar46._0_8_ = *(ulong *)(lVar22 + 0x28 + lVar27);
          auVar37 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x24 + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,auVar46);
          a0.field_0 = _DAT_02060e80;
        }
      }
      else if (iVar115 == 0xb001) {
        lVar22 = *plVar25;
        lVar27 = plVar25[2] * uVar21;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar27);
        auVar35 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar22 + 8 + lVar27)),0x20);
        auVar117._8_8_ = 0;
        auVar117._0_8_ = *(ulong *)(lVar22 + 0x34 + lVar27);
        auVar36 = vpermt2ps_avx512vl(auVar117,_DAT_02060e90,ZEXT416(*(uint *)(lVar22 + lVar27)));
        auVar176._8_8_ = 0;
        auVar176._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar27);
        fVar77 = *(float *)(lVar22 + 0x24 + lVar27);
        fVar33 = *(float *)(lVar22 + 0x28 + lVar27);
        auVar41 = ZEXT416((uint)fVar33);
        fVar138 = *(float *)(lVar22 + 0x2c + lVar27);
        auVar37 = vpermt2ps_avx512vl(auVar176,_DAT_02060e90,
                                     ZEXT416(*(uint *)(lVar22 + 0x18 + lVar27)));
        fVar174 = *(float *)(lVar22 + 0x30 + lVar27);
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),ZEXT416((uint)fVar77),
                                  ZEXT416((uint)fVar77));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
        auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar174),ZEXT416((uint)fVar174));
        auVar38 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar34._0_4_));
        fVar194 = auVar38._0_4_;
        fVar194 = fVar194 * 1.5 + fVar194 * fVar194 * fVar194 * auVar34._0_4_ * -0.5;
        auVar38 = ZEXT416((uint)fVar194);
        auVar39 = ZEXT416((uint)(fVar77 * fVar194));
        auVar37 = vinsertps_avx512f(auVar37,ZEXT416((uint)(fVar77 * fVar194)),0x30);
        auVar34 = vinsertps_avx512f(auVar36,ZEXT416((uint)(fVar33 * fVar194)),0x30);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     ZEXT416((uint)(fVar138 * fVar194));
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       ZEXT416((uint)(fVar174 * fVar194));
        auVar36 = vinsertps_avx512f(auVar35,ZEXT416((uint)(fVar174 * fVar194)),0x30);
        auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 0xc + lVar27)),
                                ZEXT416(*(uint *)(lVar22 + 4 + lVar27)),0x10);
        auVar46 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar22 + 0x3c + lVar27)),0x20);
        auVar35 = vinsertps_avx512f(auVar46,ZEXT416((uint)(fVar138 * fVar194)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar22 = *plVar25;
        lVar27 = plVar25[2] * uVar21;
        auVar34 = *(undefined1 (*) [16])(lVar22 + lVar27);
        auVar35 = *(undefined1 (*) [16])(lVar22 + 0x10 + lVar27);
        auVar36 = *(undefined1 (*) [16])(lVar22 + 0x20 + lVar27);
        auVar37 = *(undefined1 (*) [16])(lVar22 + 0x30 + lVar27);
      }
      lVar22 = (ulong)(iVar23 + 1) * 0x38;
      puVar1 = (undefined8 *)(lVar28 + lVar22);
      iVar115 = *(int *)(lVar28 + 0x20 + lVar22);
      plVar25 = (long *)0x0;
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          plVar25 = (long *)*puVar1;
          lVar28 = uVar21 * puVar1[2];
          auVar38 = vinsertps_avx(ZEXT416(*(uint *)((long)plVar25 + lVar28)),
                                  ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0x10)),0x1c);
          auVar46 = vinsertps_avx(auVar38,ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0x20)),0x28);
          auVar38 = vinsertps_avx(ZEXT416(*(uint *)((long)plVar25 + lVar28 + 4)),
                                  ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0x14)),0x1c);
          auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0x24)),0x28);
          auVar40 = vinsertps_avx(ZEXT416(*(uint *)((long)plVar25 + lVar28 + 8)),
                                  ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0x18)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar40,ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0x28)),
                                       0x28);
          auVar40 = vinsertps_avx(ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0xc)),
                                  ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0x1c)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar40,ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0x2c)),0x28)
          ;
        }
        else if (iVar115 == 0x9234) {
          plVar25 = (long *)*puVar1;
          lVar28 = uVar21 * puVar1[2];
          auVar118._8_8_ = 0;
          auVar118._0_8_ = *(ulong *)((long)plVar25 + lVar28 + 4);
          auVar139._8_8_ = 0;
          auVar139._0_8_ = *(ulong *)((long)plVar25 + lVar28 + 0x10);
          auVar46 = vpermt2ps_avx512vl(ZEXT416(*(uint *)((long)plVar25 + lVar28)),
                                       (undefined1  [16])_DAT_02060e80,auVar118);
          auVar38 = vpermt2ps_avx512vl(ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0xc)),
                                       (undefined1  [16])_DAT_02060e80,auVar139);
          auVar119._8_8_ = 0;
          auVar119._0_8_ = *(ulong *)((long)plVar25 + lVar28 + 0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vpermt2ps_avx512vl(ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0x18)),
                                            (undefined1  [16])_DAT_02060e80,auVar119);
          auVar177._8_8_ = 0;
          auVar177._0_8_ = *(ulong *)((long)plVar25 + lVar28 + 0x28);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0x24)),
                                          (undefined1  [16])_DAT_02060e80,auVar177);
        }
      }
      else if (iVar115 == 0xb001) {
        plVar25 = (long *)*puVar1;
        lVar28 = uVar21 * puVar1[2];
        auVar83._8_8_ = 0;
        auVar83._0_8_ = *(ulong *)((long)plVar25 + lVar28 + 0x10);
        auVar38 = vinsertps_avx(auVar83,ZEXT416(*(uint *)((long)plVar25 + lVar28 + 8)),0x20);
        auVar84._8_8_ = 0;
        auVar84._0_8_ = *(ulong *)((long)plVar25 + lVar28 + 0x34);
        auVar44 = vpermt2ps_avx512vl(auVar84,_DAT_02060e90,
                                     ZEXT416(*(uint *)((long)plVar25 + lVar28)));
        auVar178._8_8_ = 0;
        auVar178._0_8_ = *(ulong *)((long)plVar25 + lVar28 + 0x1c);
        fVar77 = *(float *)((long)plVar25 + lVar28 + 0x24);
        auVar39 = ZEXT416((uint)fVar77);
        fVar33 = *(float *)((long)plVar25 + lVar28 + 0x28);
        auVar41 = ZEXT416((uint)fVar33);
        fVar138 = *(float *)((long)plVar25 + lVar28 + 0x2c);
        auVar46 = vpermt2ps_avx512vl(auVar178,_DAT_02060e90,
                                     ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0x18)));
        fVar174 = *(float *)((long)plVar25 + lVar28 + 0x30);
        auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),ZEXT416((uint)fVar77),
                                  ZEXT416((uint)fVar77));
        auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
        auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar174),ZEXT416((uint)fVar174));
        auVar219._4_12_ = ZEXT812(0) << 0x20;
        auVar219._0_4_ = auVar40._0_4_;
        auVar47 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar219);
        fVar194 = auVar47._0_4_;
        fVar194 = fVar194 * 1.5 + fVar194 * fVar194 * fVar194 * auVar40._0_4_ * -0.5;
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar46,ZEXT416((uint)(fVar194 * fVar77)),0x30);
        auVar46 = vinsertps_avx(auVar44,ZEXT416((uint)(fVar194 * fVar33)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar38,ZEXT416((uint)(fVar194 * fVar174)),0x30);
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0xc)),
                                ZEXT416(*(uint *)((long)plVar25 + lVar28 + 4)),0x10);
        auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)((long)plVar25 + lVar28 + 0x3c)),0x20);
        auVar38 = vinsertps_avx(auVar38,ZEXT416((uint)(fVar138 * fVar194)),0x30);
      }
      else if (iVar115 == 0x9244) {
        plVar25 = (long *)*puVar1;
        lVar28 = uVar21 * puVar1[2];
        auVar46 = *(undefined1 (*) [16])((long)plVar25 + lVar28);
        auVar38 = *(undefined1 (*) [16])((long)plVar25 + lVar28 + 0x10);
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((long)plVar25 + lVar28 + 0x20))->v;
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((long)plVar25 + lVar28 + 0x30))->v;
      }
      fVar77 = 1.0 - fVar114;
      b0.field_0.v[1] = fVar114;
      b0.field_0.v[0] = fVar114;
      b0.field_0.v[2] = fVar114;
      b0.field_0.v[3] = fVar114;
      auVar85._0_4_ = fVar114 * auVar46._0_4_;
      auVar85._4_4_ = fVar114 * auVar46._4_4_;
      auVar85._8_4_ = fVar114 * auVar46._8_4_;
      auVar85._12_4_ = fVar114 * auVar46._12_4_;
      aVar45.v[1] = fVar77;
      aVar45.v[0] = fVar77;
      aVar45.v[2] = fVar77;
      aVar45.v[3] = fVar77;
      auVar34 = vfmadd213ps_avx512vl(auVar34,(undefined1  [16])aVar45,auVar85);
      auVar86._0_4_ = fVar114 * auVar38._0_4_;
      auVar86._4_4_ = fVar114 * auVar38._4_4_;
      auVar86._8_4_ = fVar114 * auVar38._8_4_;
      auVar86._12_4_ = fVar114 * auVar38._12_4_;
      auVar35 = vfmadd213ps_avx512vl(auVar35,(undefined1  [16])aVar45,auVar86);
      auVar87._0_4_ = fVar114 * a0_1.field_0._0_4_;
      auVar87._4_4_ = fVar114 * a0_1.field_0._4_4_;
      auVar87._8_4_ = fVar114 * a0_1.field_0._8_4_;
      auVar87._12_4_ = fVar114 * a0_1.field_0._12_4_;
      auVar36 = vfmadd213ps_avx512vl(auVar36,(undefined1  [16])aVar45,auVar87);
      a0_2.field_0.v[0] = fVar114 * a0.field_0._0_4_;
      a0_2.field_0.v[1] = fVar114 * a0.field_0._4_4_;
      a0_2.field_0.v[2] = fVar114 * a0.field_0._8_4_;
      a0_2.field_0.v[3] = fVar114 * a0.field_0._12_4_;
      auVar37 = vfmadd213ps_avx512vl
                          (auVar37,(undefined1  [16])aVar45,(undefined1  [16])a0_2.field_0);
    }
  }
  uVar21 = (ulong)prim->primID_;
  if (pGVar2->numTimeSteps == 1) {
    plVar25 = *(long **)&pGVar2[1].fnumTimeSegments;
    iVar115 = (int)plVar25[4];
    if ((pGVar2->field_8).field_0x1 == '\x01') {
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar28 = *plVar25;
          lVar22 = uVar21 * plVar25[2];
          auVar38 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x10 + lVar22)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar38,ZEXT416(*(uint *)(lVar28 + 0x20 + lVar22)),0x28);
          auVar38 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 4 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x14 + lVar22)),0x1c);
          aVar45 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar38,ZEXT416(*(uint *)(lVar28 + 0x24 + lVar22)),0x28);
          auVar38 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 8 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar38,ZEXT416(*(uint *)(lVar28 + 0x28 + lVar22)),0x28);
          auVar38 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x1c + lVar22)),0x1c);
          auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(lVar28 + 0x2c + lVar22)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar28 = *plVar25;
          lVar22 = uVar21 * plVar25[2];
          auVar94._8_8_ = 0;
          auVar94._0_8_ = *(ulong *)(lVar28 + 4 + lVar22);
          auVar143._8_8_ = 0;
          auVar143._0_8_ = *(ulong *)(lVar28 + 0x10 + lVar22);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + lVar22)),
                                          (undefined1  [16])_DAT_02060e80,auVar94);
          aVar45.v = (__m128)vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                                _DAT_02060e80,auVar143);
          auVar95._8_8_ = 0;
          auVar95._0_8_ = *(ulong *)(lVar28 + 0x1c + lVar22);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)),
                                            (undefined1  [16])_DAT_02060e80,auVar95);
          auVar96._8_8_ = 0;
          auVar96._0_8_ = *(ulong *)(lVar28 + 0x28 + lVar22);
          auVar38 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0x24 + lVar22)),
                                       (undefined1  [16])_DAT_02060e80,auVar96);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar28 = *plVar25;
        lVar22 = uVar21 * plVar25[2];
        auVar105._8_8_ = 0;
        auVar105._0_8_ = *(ulong *)(lVar28 + 0x10 + lVar22);
        auVar41 = vinsertps_avx(auVar105,ZEXT416(*(uint *)(lVar28 + 8 + lVar22)),0x20);
        auVar125._8_8_ = 0;
        auVar125._0_8_ = *(ulong *)(lVar28 + 0x34 + lVar22);
        auVar39 = vpermt2ps_avx512vl(auVar125,_DAT_02060e90,ZEXT416(*(uint *)(lVar28 + lVar22)));
        auVar187._8_8_ = 0;
        auVar187._0_8_ = *(ulong *)(lVar28 + 0x1c + lVar22);
        fVar114 = *(float *)(lVar28 + 0x24 + lVar22);
        fVar77 = *(float *)(lVar28 + 0x28 + lVar22);
        fVar33 = *(float *)(lVar28 + 0x2c + lVar22);
        auVar40 = vpermt2ps_avx512vl(auVar187,_DAT_02060e90,
                                     ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)));
        fVar138 = *(float *)(lVar28 + 0x30 + lVar22);
        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar77 * fVar77)),ZEXT416((uint)fVar114),
                                  ZEXT416((uint)fVar114));
        auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
        auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
        auVar44 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar38._0_4_));
        fVar174 = auVar44._0_4_;
        fVar174 = fVar174 * 1.5 + fVar174 * fVar174 * fVar174 * auVar38._0_4_ * -0.5;
        auVar38 = vinsertps_avx(auVar40,ZEXT416((uint)(fVar174 * fVar114)),0x30);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar39,ZEXT416((uint)(fVar174 * fVar77)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar41,ZEXT416((uint)(fVar174 * fVar138)),0x30);
        auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                ZEXT416(*(uint *)(lVar28 + 4 + lVar22)),0x10);
        auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(lVar28 + 0x3c + lVar22)),0x20);
        aVar45 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vinsertps_avx(auVar41,ZEXT416((uint)(fVar33 * fVar174)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar28 = *plVar25;
        lVar22 = uVar21 * plVar25[2];
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar28 + lVar22))->v;
        aVar45 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                  ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar28 + 0x10 + lVar22))->v;
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar28 + 0x20 + lVar22))
                        ->v;
        auVar38 = *(undefined1 (*) [16])(lVar28 + 0x30 + lVar22);
      }
      auVar39 = vshufps_avx(auVar38,auVar38,0xff);
      auVar40 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar44 = vshufps_avx((undefined1  [16])aVar45,(undefined1  [16])aVar45,0xff);
      auVar48 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar41 = vshufps_avx((undefined1  [16])a0.field_0,ZEXT816(0) << 0x40,0xe9);
      auVar41 = vblendps_avx(auVar41,(undefined1  [16])aVar45,4);
      fVar194 = auVar40._0_4_;
      auVar42 = vfmadd213ss_fma(auVar39,auVar39,ZEXT416((uint)(fVar194 * fVar194)));
      auVar42 = vfnmadd231ss_fma(auVar42,auVar44,auVar44);
      auVar43 = vfnmadd231ss_fma(auVar42,auVar48,auVar48);
      fVar174 = auVar39._0_4_;
      auVar46 = ZEXT416((uint)(auVar48._0_4_ * fVar174));
      auVar42 = vfmadd213ss_fma(auVar44,auVar40,auVar46);
      fVar114 = auVar42._0_4_ + auVar42._0_4_;
      auVar59 = ZEXT416((uint)(auVar44._0_4_ * fVar174));
      auVar42 = vfmsub213ss_fma(auVar48,auVar40,auVar59);
      fVar77 = auVar42._0_4_ + auVar42._0_4_;
      auVar42 = vfmsub231ss_fma(auVar46,auVar40,auVar44);
      fVar33 = auVar42._0_4_ + auVar42._0_4_;
      auVar42 = vfmsub231ss_fma(ZEXT416((uint)(fVar194 * fVar194)),auVar39,auVar39);
      auVar39 = vfmadd213ss_avx512f(auVar44,auVar44,auVar42);
      auVar46 = vfnmadd231ss_avx512f(auVar39,auVar48,auVar48);
      auVar39 = vfmadd213ss_avx512f(auVar48,auVar44,ZEXT416((uint)(fVar174 * fVar194)));
      auVar47 = vaddss_avx512f(auVar39,auVar39);
      auVar39 = vfmadd213ss_fma(auVar40,auVar48,auVar59);
      fVar138 = auVar39._0_4_ + auVar39._0_4_;
      auVar39 = vfmsub231ss_fma(ZEXT416((uint)(fVar174 * fVar194)),auVar44,auVar48);
      fVar174 = auVar39._0_4_ + auVar39._0_4_;
      auVar39 = vfnmadd231ss_fma(auVar42,auVar44,auVar44);
      auVar40 = vfmadd231ss_fma(auVar39,auVar48,auVar48);
      uVar154 = auVar43._0_4_;
      auVar210._4_4_ = uVar154;
      auVar210._0_4_ = uVar154;
      auVar210._8_4_ = uVar154;
      auVar210._12_4_ = uVar154;
      auVar217._4_4_ = fVar114;
      auVar217._0_4_ = fVar114;
      auVar217._8_4_ = fVar114;
      auVar217._12_4_ = fVar114;
      auVar224._0_4_ = fVar77 * 0.0;
      auVar224._4_4_ = fVar77 * 0.0;
      auVar224._8_4_ = fVar77 * 1.0;
      auVar224._12_4_ = fVar77 * 0.0;
      auVar42 = ZEXT816(0x3f80000000000000);
      auVar39 = vfmadd231ps_fma(auVar224,auVar42,auVar217);
      auVar43 = SUB6416(ZEXT464(0x3f800000),0);
      auVar44 = vfmadd231ps_fma(auVar39,auVar43,auVar210);
      auVar211._4_4_ = fVar33;
      auVar211._0_4_ = fVar33;
      auVar211._8_4_ = fVar33;
      auVar211._12_4_ = fVar33;
      auVar39 = vbroadcastss_avx512vl(auVar46);
      auVar48 = vbroadcastss_avx512vl(auVar47);
      auVar223._0_4_ = auVar48._0_4_ * 0.0;
      auVar223._4_4_ = auVar48._4_4_ * 0.0;
      auVar223._8_4_ = auVar48._8_4_ * 1.0;
      auVar223._12_4_ = auVar48._12_4_ * 0.0;
      auVar39 = vfmadd231ps_fma(auVar223,auVar42,auVar39);
      auVar48 = vfmadd231ps_fma(auVar39,auVar43,auVar211);
      auVar203._4_4_ = fVar138;
      auVar203._0_4_ = fVar138;
      auVar203._8_4_ = fVar138;
      auVar203._12_4_ = fVar138;
      auVar197._4_4_ = fVar174;
      auVar197._0_4_ = fVar174;
      auVar197._8_4_ = fVar174;
      auVar197._12_4_ = fVar174;
      fVar114 = auVar40._0_4_;
      auVar212._0_4_ = fVar114 * 0.0;
      auVar212._4_4_ = fVar114 * 0.0;
      auVar212._8_4_ = fVar114 * 1.0;
      auVar212._12_4_ = fVar114 * 0.0;
      auVar39 = vfmadd231ps_fma(auVar212,auVar42,auVar197);
      auVar39 = vfmadd231ps_fma(auVar39,auVar43,auVar203);
      auVar126._0_4_ = a0.field_0._0_4_;
      auVar126._4_4_ = auVar126._0_4_;
      auVar126._8_4_ = auVar126._0_4_;
      auVar126._12_4_ = auVar126._0_4_;
      fVar114 = auVar39._0_4_;
      auVar198._0_4_ = fVar114 * 0.0;
      fVar77 = auVar39._4_4_;
      auVar198._4_4_ = fVar77 * 0.0;
      fVar33 = auVar39._8_4_;
      auVar198._8_4_ = fVar33 * 0.0;
      fVar138 = auVar39._12_4_;
      auVar198._12_4_ = fVar138 * 0.0;
      auVar39 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar48,auVar198);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar39,auVar44,auVar126);
      iVar115 = aVar45.i[0];
      auVar204._4_4_ = iVar115;
      auVar204._0_4_ = iVar115;
      auVar204._8_4_ = iVar115;
      auVar204._12_4_ = iVar115;
      auVar39 = vshufps_avx((undefined1  [16])aVar45,(undefined1  [16])aVar45,0x55);
      auVar39 = vfmadd213ps_fma(auVar39,auVar48,auVar198);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar39,auVar44,auVar204);
      iVar115 = a0_1.field_0._0_4_;
      auVar171._4_4_ = iVar115;
      auVar171._0_4_ = iVar115;
      auVar171._8_4_ = iVar115;
      auVar171._12_4_ = iVar115;
      auVar39 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
      auVar40 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
      auVar145._0_4_ = fVar114 * auVar40._0_4_;
      auVar145._4_4_ = fVar77 * auVar40._4_4_;
      auVar145._8_4_ = fVar33 * auVar40._8_4_;
      auVar145._12_4_ = fVar138 * auVar40._12_4_;
      auVar39 = vfmadd231ps_fma(auVar145,auVar48,auVar39);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar39,auVar44,auVar171);
      uVar154 = auVar38._0_4_;
      auVar172._4_4_ = uVar154;
      auVar172._0_4_ = uVar154;
      auVar172._8_4_ = uVar154;
      auVar172._12_4_ = uVar154;
      auVar39 = vshufps_avx(auVar38,auVar38,0x55);
      auVar38 = vshufps_avx(auVar38,auVar38,0xaa);
      auVar160._0_4_ = fVar114 * auVar38._0_4_;
      auVar160._4_4_ = fVar77 * auVar38._4_4_;
      auVar160._8_4_ = fVar33 * auVar38._8_4_;
      auVar160._12_4_ = fVar138 * auVar38._12_4_;
      auVar38 = vfmadd231ps_fma(auVar160,auVar48,auVar39);
      auVar39 = vfmadd231ps_fma(auVar38,auVar44,auVar172);
      auVar38._0_4_ = auVar41._0_4_ + 0.0 + auVar39._0_4_;
      auVar38._4_4_ = auVar41._4_4_ + 0.0 + auVar39._4_4_;
      auVar38._8_4_ = auVar41._8_4_ + 0.0 + auVar39._8_4_;
      auVar38._12_4_ = auVar41._12_4_ + 0.0 + auVar39._12_4_;
    }
    else if (iVar115 < 0x9244) {
      if (iVar115 == 0x9134) {
        lVar28 = *plVar25;
        lVar22 = uVar21 * plVar25[2];
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + lVar22)),
                                ZEXT416(*(uint *)(lVar28 + 0x10 + lVar22)),0x1c);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar38,ZEXT416(*(uint *)(lVar28 + 0x20 + lVar22)),0x28);
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 4 + lVar22)),
                                ZEXT416(*(uint *)(lVar28 + 0x14 + lVar22)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar38,ZEXT416(*(uint *)(lVar28 + 0x24 + lVar22)),0x28);
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 8 + lVar22)),
                                ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar38,ZEXT416(*(uint *)(lVar28 + 0x28 + lVar22)),0x28);
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                ZEXT416(*(uint *)(lVar28 + 0x1c + lVar22)),0x1c);
        auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(lVar28 + 0x2c + lVar22)),0x28);
      }
      else if (iVar115 == 0x9234) {
        lVar28 = *plVar25;
        lVar22 = uVar21 * plVar25[2];
        auVar140._8_8_ = 0;
        auVar140._0_8_ = *(ulong *)(lVar28 + 4 + lVar22);
        auVar155._8_8_ = 0;
        auVar155._0_8_ = *(ulong *)(lVar28 + 0x10 + lVar22);
        a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + lVar22)),
                                          (undefined1  [16])_DAT_02060e80,auVar140);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                        (undefined1  [16])_DAT_02060e80,auVar155);
        auVar156._8_8_ = 0;
        auVar156._0_8_ = *(ulong *)(lVar28 + 0x1c + lVar22);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)),
                                          (undefined1  [16])_DAT_02060e80,auVar156);
        auVar179._8_8_ = 0;
        auVar179._0_8_ = *(ulong *)(lVar28 + 0x28 + lVar22);
        auVar38 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0x24 + lVar22)),
                                     (undefined1  [16])_DAT_02060e80,auVar179);
      }
    }
    else if (iVar115 == 0xb001) {
      lVar28 = *plVar25;
      lVar22 = uVar21 * plVar25[2];
      auVar88._8_8_ = 0;
      auVar88._0_8_ = *(ulong *)(lVar28 + 0x10 + lVar22);
      auVar41 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(lVar28 + 8 + lVar22)),0x20);
      auVar89._8_8_ = 0;
      auVar89._0_8_ = *(ulong *)(lVar28 + 0x34 + lVar22);
      auVar39 = vpermt2ps_avx512vl(auVar89,_DAT_02060e90,ZEXT416(*(uint *)(lVar28 + lVar22)));
      auVar180._8_8_ = 0;
      auVar180._0_8_ = *(ulong *)(lVar28 + 0x1c + lVar22);
      fVar114 = *(float *)(lVar28 + 0x24 + lVar22);
      fVar77 = *(float *)(lVar28 + 0x28 + lVar22);
      fVar33 = *(float *)(lVar28 + 0x2c + lVar22);
      auVar40 = vpermt2ps_avx512vl(auVar180,_DAT_02060e90,ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22))
                                  );
      fVar138 = *(float *)(lVar28 + 0x30 + lVar22);
      auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar77 * fVar77)),ZEXT416((uint)fVar114),
                                ZEXT416((uint)fVar114));
      auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
      auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
      auVar44 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar38._0_4_));
      fVar174 = auVar44._0_4_;
      fVar174 = fVar174 * 1.5 + fVar174 * fVar174 * fVar174 * auVar38._0_4_ * -0.5;
      auVar38 = vinsertps_avx(auVar40,ZEXT416((uint)(fVar174 * fVar114)),0x30);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar39,ZEXT416((uint)(fVar174 * fVar77)),0x30);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar41,ZEXT416((uint)(fVar174 * fVar138)),0x30);
      auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                              ZEXT416(*(uint *)(lVar28 + 4 + lVar22)),0x10);
      auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(lVar28 + 0x3c + lVar22)),0x20);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar41,ZEXT416((uint)(fVar33 * fVar174)),0x30);
    }
    else if (iVar115 == 0x9244) {
      lVar28 = *plVar25;
      lVar22 = uVar21 * plVar25[2];
      a0_2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar28 + lVar22))->v;
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar28 + 0x10 + lVar22))->v;
      a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar28 + 0x20 + lVar22))->v
      ;
      auVar38 = *(undefined1 (*) [16])(lVar28 + 0x30 + lVar22);
    }
  }
  else {
    fVar114 = (pGVar2->time_range).lower;
    fVar77 = (pGVar2->time_range).upper;
    auVar46 = ZEXT416((uint)fVar77);
    fVar114 = pGVar2->fnumTimeSegments * ((query->time - fVar114) / (fVar77 - fVar114));
    auVar38 = ZEXT416((uint)fVar114);
    auVar40 = vroundss_avx(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),9);
    auVar40 = vminss_avx(auVar40,ZEXT416((uint)(pGVar2->fnumTimeSegments + -1.0)));
    auVar44 = ZEXT816(0) << 0x20;
    auVar40 = vmaxss_avx(auVar44,auVar40);
    fVar114 = fVar114 - auVar40._0_4_;
    auVar47 = ZEXT416((uint)fVar114);
    iVar23 = (int)auVar40._0_4_;
    lVar28 = *(long *)&pGVar2[1].fnumTimeSegments;
    lVar22 = CONCAT44((int)((ulong)plVar25 >> 0x20),iVar23) * 0x38;
    plVar25 = (long *)(lVar28 + lVar22);
    iVar115 = *(int *)(lVar28 + 0x20 + lVar22);
    if ((pGVar2->field_8).field_0x1 == '\x01') {
      auVar38 = ZEXT416((uint)fVar114);
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar22 = *plVar25;
          lVar27 = plVar25[2] * uVar21;
          auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + lVar27)),
                                  ZEXT416(*(uint *)(lVar22 + 0x10 + lVar27)),0x1c);
          auVar48 = vinsertps_avx512f(auVar41,ZEXT416(*(uint *)(lVar22 + 0x20 + lVar27)),0x28);
          auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 4 + lVar27)),
                                  ZEXT416(*(uint *)(lVar22 + 0x14 + lVar27)),0x1c);
          auVar42 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(lVar22 + 0x24 + lVar27)),0x28);
          auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 8 + lVar27)),
                                  ZEXT416(*(uint *)(lVar22 + 0x18 + lVar27)),0x1c);
          auVar43 = vinsertps_avx512f(auVar41,ZEXT416(*(uint *)(lVar22 + 0x28 + lVar27)),0x28);
          auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 0xc + lVar27)),
                                  ZEXT416(*(uint *)(lVar22 + 0x1c + lVar27)),0x1c);
          auVar47 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(lVar22 + 0x2c + lVar27)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar22 = *plVar25;
          lVar27 = plVar25[2] * uVar21;
          auVar97._8_8_ = 0;
          auVar97._0_8_ = *(ulong *)(lVar22 + 4 + lVar27);
          auVar144._8_8_ = 0;
          auVar144._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar27);
          auVar48 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,auVar97);
          auVar42 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0xc + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,auVar144);
          auVar98._8_8_ = 0;
          auVar98._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar27);
          auVar43 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x18 + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,auVar98);
          auVar99._8_8_ = 0;
          auVar99._0_8_ = *(ulong *)(lVar22 + 0x28 + lVar27);
          auVar47 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x24 + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,auVar99);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar22 = *plVar25;
        lVar27 = plVar25[2] * uVar21;
        auVar106._8_8_ = 0;
        auVar106._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar27);
        auVar41 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(lVar22 + 8 + lVar27)),0x20);
        auVar127._8_8_ = 0;
        auVar127._0_8_ = *(ulong *)(lVar22 + 0x34 + lVar27);
        auVar40 = vpermt2ps_avx512vl(auVar127,_DAT_02060e90,ZEXT416(*(uint *)(lVar22 + lVar27)));
        auVar188._8_8_ = 0;
        auVar188._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar27);
        fVar77 = *(float *)(lVar22 + 0x24 + lVar27);
        fVar33 = *(float *)(lVar22 + 0x28 + lVar27);
        fVar138 = *(float *)(lVar22 + 0x2c + lVar27);
        auVar44 = vpermt2ps_avx512vl(auVar188,_DAT_02060e90,
                                     ZEXT416(*(uint *)(lVar22 + 0x18 + lVar27)));
        fVar174 = *(float *)(lVar22 + 0x30 + lVar27);
        auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),ZEXT416((uint)fVar77),
                                  ZEXT416((uint)fVar77));
        auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
        auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar174),ZEXT416((uint)fVar174));
        auVar48 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar39._0_4_));
        fVar194 = auVar48._0_4_;
        fVar194 = fVar194 * 1.5 + fVar194 * fVar194 * fVar194 * auVar39._0_4_ * -0.5;
        auVar47 = vinsertps_avx(auVar44,ZEXT416((uint)(fVar77 * fVar194)),0x30);
        auVar48 = vinsertps_avx512f(auVar40,ZEXT416((uint)(fVar33 * fVar194)),0x30);
        auVar43 = vinsertps_avx512f(auVar41,ZEXT416((uint)(fVar174 * fVar194)),0x30);
        auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 0xc + lVar27)),
                                ZEXT416(*(uint *)(lVar22 + 4 + lVar27)),0x10);
        auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(lVar22 + 0x3c + lVar27)),0x20);
        auVar42 = vinsertps_avx(auVar41,ZEXT416((uint)(fVar138 * fVar194)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar22 = *plVar25;
        lVar27 = plVar25[2] * uVar21;
        auVar48 = *(undefined1 (*) [16])(lVar22 + lVar27);
        auVar42 = *(undefined1 (*) [16])(lVar22 + 0x10 + lVar27);
        auVar43 = *(undefined1 (*) [16])(lVar22 + 0x20 + lVar27);
        auVar47 = *(undefined1 (*) [16])(lVar22 + 0x30 + lVar27);
      }
      lVar22 = (ulong)(iVar23 + 1) * 0x38;
      plVar25 = (long *)(lVar28 + lVar22);
      iVar115 = *(int *)(lVar28 + 0x20 + lVar22);
      auVar44 = auVar35;
      auVar41 = auVar34;
      auVar39 = auVar37;
      auVar40 = auVar36;
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar28 = *plVar25;
          lVar22 = uVar21 * plVar25[2];
          auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x10 + lVar22)),0x1c);
          auVar41 = vinsertps_avx512f(auVar41,ZEXT416(*(uint *)(lVar28 + 0x20 + lVar22)),0x28);
          auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 4 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x14 + lVar22)),0x1c);
          auVar39 = vinsertps_avx512f(auVar39,ZEXT416(*(uint *)(lVar28 + 0x24 + lVar22)),0x28);
          auVar40 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 8 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)),0x1c);
          auVar40 = vinsertps_avx512f(auVar40,ZEXT416(*(uint *)(lVar28 + 0x28 + lVar22)),0x28);
          auVar44 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x1c + lVar22)),0x1c);
          auVar44 = vinsertps_avx512f(auVar44,ZEXT416(*(uint *)(lVar28 + 0x2c + lVar22)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar28 = *plVar25;
          lVar22 = uVar21 * plVar25[2];
          auVar107._8_8_ = 0;
          auVar107._0_8_ = *(ulong *)(lVar28 + 4 + lVar22);
          auVar146._8_8_ = 0;
          auVar146._0_8_ = *(ulong *)(lVar28 + 0x10 + lVar22);
          auVar41 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + lVar22)),
                                       (undefined1  [16])_DAT_02060e80,auVar107);
          auVar39 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                       (undefined1  [16])_DAT_02060e80,auVar146);
          auVar108._8_8_ = 0;
          auVar108._0_8_ = *(ulong *)(lVar28 + 0x1c + lVar22);
          auVar40 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)),
                                       (undefined1  [16])_DAT_02060e80,auVar108);
          auVar109._8_8_ = 0;
          auVar109._0_8_ = *(ulong *)(lVar28 + 0x28 + lVar22);
          auVar44 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0x24 + lVar22)),
                                       (undefined1  [16])_DAT_02060e80,auVar109);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar28 = *plVar25;
        lVar22 = uVar21 * plVar25[2];
        auVar113._8_8_ = 0;
        auVar113._0_8_ = *(ulong *)(lVar28 + 0x10 + lVar22);
        auVar39 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(lVar28 + 8 + lVar22)),0x20);
        auVar133._8_8_ = 0;
        auVar133._0_8_ = *(ulong *)(lVar28 + 0x34 + lVar22);
        auVar40 = vpermt2ps_avx512vl(auVar133,_DAT_02060e90,ZEXT416(*(uint *)(lVar28 + lVar22)));
        auVar190._8_8_ = 0;
        auVar190._0_8_ = *(ulong *)(lVar28 + 0x1c + lVar22);
        fVar77 = *(float *)(lVar28 + 0x24 + lVar22);
        fVar33 = *(float *)(lVar28 + 0x28 + lVar22);
        fVar138 = *(float *)(lVar28 + 0x2c + lVar22);
        auVar44 = vpermt2ps_avx512vl(auVar190,_DAT_02060e90,
                                     ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)));
        fVar174 = *(float *)(lVar28 + 0x30 + lVar22);
        auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),ZEXT416((uint)fVar77),
                                  ZEXT416((uint)fVar77));
        auVar41 = vfmadd231ss_fma(auVar41,ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
        auVar41 = vfmadd231ss_fma(auVar41,ZEXT416((uint)fVar174),ZEXT416((uint)fVar174));
        auVar220._4_12_ = ZEXT812(0) << 0x20;
        auVar220._0_4_ = auVar41._0_4_;
        auVar46 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar220);
        fVar194 = auVar46._0_4_;
        fVar194 = fVar194 * 1.5 + fVar194 * fVar194 * fVar194 * auVar41._0_4_ * -0.5;
        auVar44 = vinsertps_avx512f(auVar44,ZEXT416((uint)(fVar77 * fVar194)),0x30);
        auVar41 = vinsertps_avx512f(auVar40,ZEXT416((uint)(fVar33 * fVar194)),0x30);
        auVar40 = vinsertps_avx512f(auVar39,ZEXT416((uint)(fVar174 * fVar194)),0x30);
        auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                ZEXT416(*(uint *)(lVar28 + 4 + lVar22)),0x10);
        auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar28 + 0x3c + lVar22)),0x20);
        auVar39 = vinsertps_avx512f(auVar39,ZEXT416((uint)(fVar138 * fVar194)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar28 = *plVar25;
        lVar22 = uVar21 * plVar25[2];
        auVar41 = *(undefined1 (*) [16])(lVar28 + lVar22);
        auVar39 = *(undefined1 (*) [16])(lVar28 + 0x10 + lVar22);
        auVar40 = *(undefined1 (*) [16])(lVar28 + 0x20 + lVar22);
        auVar44 = *(undefined1 (*) [16])(lVar28 + 0x30 + lVar22);
      }
      auVar56 = vshufps_avx512vl(auVar47,auVar47,0xff);
      auVar57 = vshufps_avx512vl(auVar48,auVar48,0xff);
      auVar46 = vshufps_avx(auVar42,auVar42,0xff);
      auVar58 = vshufps_avx512vl(auVar43,auVar43,0xff);
      auVar59 = vshufps_avx512vl(auVar44,auVar44,0xff);
      auVar60 = vshufps_avx512vl(auVar41,auVar41,0xff);
      auVar61 = vshufps_avx512vl(auVar39,auVar39,0xff);
      auVar62 = vshufps_avx512vl(auVar40,auVar40,0xff);
      auVar63 = vmulss_avx512f(auVar57,auVar60);
      auVar63 = vfmadd231ss_avx512f(auVar63,auVar59,auVar56);
      auVar63 = vfmadd231ss_avx512f(auVar63,auVar61,auVar46);
      auVar63 = vfmadd231ss_avx512f(auVar63,auVar62,auVar58);
      auVar206._8_4_ = 0x80000000;
      auVar206._0_8_ = 0x8000000080000000;
      auVar206._12_4_ = 0x80000000;
      auVar134._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
      auVar134._8_4_ = auVar63._8_4_ ^ 0x80000000;
      auVar134._12_4_ = auVar63._12_4_ ^ 0x80000000;
      bVar30 = auVar63._0_4_ < -auVar63._0_4_;
      auVar64 = vxorps_avx512vl(auVar59,auVar206);
      auVar65 = vxorps_avx512vl(auVar60,auVar206);
      auVar66 = vxorps_avx512vl(auVar61,auVar206);
      auVar67 = vxorps_avx512vl(auVar62,auVar206);
      auVar68._4_12_ = auVar59._4_12_;
      auVar68._0_4_ = (uint)bVar30 * auVar64._0_4_ + (uint)!bVar30 * auVar59._0_4_;
      auVar69._4_12_ = auVar60._4_12_;
      auVar69._0_4_ = (uint)bVar30 * auVar65._0_4_ + (uint)!bVar30 * auVar60._0_4_;
      auVar70._4_12_ = auVar61._4_12_;
      auVar70._0_4_ = (uint)bVar30 * auVar66._0_4_ + (uint)!bVar30 * auVar61._0_4_;
      auVar71._4_12_ = auVar62._4_12_;
      auVar71._0_4_ = (uint)bVar30 * auVar67._0_4_ + (uint)!bVar30 * auVar62._0_4_;
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar60 = vandps_avx512vl(auVar63,auVar18);
      auVar59 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar60,ZEXT416(0x3c9df1b8));
      auVar59 = vfmadd213ss_fma(auVar59,auVar60,ZEXT416(0xbd37e81c));
      auVar59 = vfmadd213ss_fma(auVar59,auVar60,ZEXT416(0x3db3edac));
      auVar59 = vfmadd213ss_fma(auVar59,auVar60,ZEXT416(0xbe5ba881));
      auVar59 = vfmadd213ss_fma(auVar59,auVar60,ZEXT416(0x3fc90fd1));
      auVar61 = vmaxss_avx512f(auVar134,auVar63);
      auVar62 = vsubss_avx512f(ZEXT416(0x3f800000),auVar60);
      auVar63 = ZEXT816(0) << 0x20;
      if (auVar62._0_4_ < 0.0) {
        local_c8 = auVar60;
        local_b8 = auVar68;
        fVar77 = sqrtf(auVar62._0_4_);
        auVar63 = ZEXT816(0) << 0x40;
        auVar61 = ZEXT416(auVar61._0_4_);
        auVar68 = local_b8;
        auVar60 = local_c8;
      }
      else {
        auVar62 = vsqrtss_avx(auVar62,auVar62);
        fVar77 = auVar62._0_4_;
      }
      auVar66 = ZEXT416(0x3f800000);
      auVar59 = vmaxss_avx(auVar63,ZEXT416((uint)(1.5707964 - fVar77 * auVar59._0_4_)));
      uVar7 = vcmpss_avx512f(auVar61,auVar63,1);
      bVar30 = (bool)((byte)uVar7 & 1);
      uVar7 = vcmpss_avx512f(auVar66,auVar60,1);
      bVar9 = (bool)((byte)uVar7 & 1);
      fVar77 = fVar114 * (float)((uint)bVar9 * 0x7fc00000 +
                                (uint)!bVar9 *
                                (int)(1.5707964 -
                                     (float)((uint)bVar30 * (auVar59._0_4_ ^ 0x80000000) +
                                            (uint)!bVar30 * auVar59._0_4_)));
      auVar59 = ZEXT416((uint)(fVar77 * 0.63661975));
      auVar59 = vroundss_avx(auVar59,auVar59,9);
      auVar60 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar59,ZEXT416((uint)fVar77));
      uVar26 = (int)auVar59._0_4_ & 3;
      uVar20 = uVar26 - 1;
      fVar33 = auVar60._0_4_;
      fVar77 = fVar33 * fVar33;
      auVar60 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar77),
                                ZEXT416(0x363938a8));
      auVar62 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar77),
                                ZEXT416(0x37cfab9c));
      auVar63 = ZEXT416((uint)fVar77);
      auVar60 = vfmadd213ss_fma(auVar60,auVar63,ZEXT416(0xb9501096));
      auVar62 = vfmadd213ss_fma(auVar62,auVar63,ZEXT416(0xbab60981));
      auVar60 = vfmadd213ss_fma(auVar60,auVar63,ZEXT416(0x3c088898));
      auVar62 = vfmadd213ss_fma(auVar62,auVar63,ZEXT416(0x3d2aaaa4));
      auVar63 = ZEXT416((uint)fVar77);
      auVar60 = vfmadd213ss_fma(auVar60,auVar63,ZEXT416(0xbe2aaaab));
      auVar62 = vfmadd213ss_fma(auVar62,auVar63,SUB6416(ZEXT464(0xbf000000),0));
      auVar60 = vfmadd213ss_avx512f(auVar60,auVar63,auVar66);
      auVar62 = vfmadd213ss_avx512f(auVar62,auVar63,auVar66);
      fVar33 = fVar33 * auVar60._0_4_;
      bVar8 = (byte)(int)auVar59._0_4_;
      uVar31 = (uint)(bVar8 & 1) * auVar62._0_4_ + (uint)!(bool)(bVar8 & 1) * (int)fVar33;
      auVar72._4_12_ = auVar62._4_12_;
      uVar32 = (uint)(bVar8 & 1) * (int)fVar33 + (uint)!(bool)(bVar8 & 1) * auVar62._0_4_;
      fVar33 = (float)((uint)(1 < uVar26) * (uVar31 ^ 0x80000000) + (1 >= uVar26) * uVar31);
      auVar72._0_4_ = (uint)(uVar20 < 2) * (uVar32 ^ 0x80000000) + (uVar20 >= 2) * uVar32;
      auVar60 = vfmsub213ss_avx512f(auVar56,auVar61,auVar68);
      auVar59 = vfmsub213ss_avx512f(auVar57,auVar61,auVar69);
      auVar62 = vfmsub213ss_avx512f(auVar46,auVar61,auVar70);
      auVar61 = vfmsub213ss_avx512f(auVar58,auVar61,auVar71);
      fVar138 = auVar59._0_4_;
      auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138)),auVar60,auVar60);
      auVar59 = vfmadd231ss_fma(auVar59,auVar62,auVar62);
      auVar59 = vfmadd231ss_fma(auVar59,auVar61,auVar61);
      auVar65 = ZEXT816(0) << 0x20;
      auVar63 = vrsqrt14ss_avx512f(auVar65,ZEXT416((uint)auVar59._0_4_));
      fVar77 = auVar63._0_4_;
      fVar77 = fVar77 * 1.5 + fVar77 * fVar77 * fVar77 * auVar59._0_4_ * -0.5;
      auVar63 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar77 * auVar60._0_4_ * fVar33)),auVar72,auVar56
                                   );
      auVar64 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar77 * fVar138 * fVar33)),auVar72,auVar57);
      auVar60 = vfmsub231ss_fma(ZEXT416((uint)(fVar77 * auVar62._0_4_ * fVar33)),auVar72,auVar46);
      auVar61 = vfmsub231ss_fma(ZEXT416((uint)(fVar77 * auVar61._0_4_ * fVar33)),auVar58,auVar72);
      auVar62 = vsubss_avx512f(auVar66,auVar38);
      auVar59 = vmulss_avx512f(auVar38,auVar68);
      auVar56 = vfmadd231ss_avx512f(auVar59,auVar62,auVar56);
      auVar59 = vmulss_avx512f(auVar38,auVar69);
      auVar59 = vfmadd231ss_avx512f(auVar59,auVar62,auVar57);
      auVar57 = vmulss_avx512f(auVar38,auVar70);
      auVar46 = vfmadd231ss_fma(auVar57,auVar62,auVar46);
      auVar38 = vmulss_avx512f(auVar38,auVar71);
      auVar38 = vfmadd231ss_fma(auVar38,auVar62,auVar58);
      fVar33 = auVar59._0_4_;
      auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),auVar56,auVar56);
      auVar59 = vfmadd231ss_fma(auVar59,auVar46,auVar46);
      auVar59 = vfmadd231ss_fma(auVar59,auVar38,auVar38);
      auVar57 = vrsqrt14ss_avx512f(auVar65,ZEXT416((uint)auVar59._0_4_));
      fVar77 = auVar57._0_4_;
      fVar77 = fVar77 * 1.5 + fVar77 * fVar77 * fVar77 * auVar59._0_4_ * -0.5;
      vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
      bVar30 = 2 < uVar20;
      auVar73._4_12_ = auVar63._4_12_;
      auVar73._0_4_ =
           (float)((uint)bVar30 * (int)(auVar56._0_4_ * fVar77) + (uint)!bVar30 * auVar63._0_4_);
      auVar74._4_12_ = auVar64._4_12_;
      auVar74._0_4_ = (float)((uint)bVar30 * (int)(fVar33 * fVar77) + (uint)!bVar30 * auVar64._0_4_)
      ;
      auVar75._4_12_ = auVar60._4_12_;
      auVar75._0_4_ =
           (float)((uint)bVar30 * (int)(auVar46._0_4_ * fVar77) + (uint)!bVar30 * auVar60._0_4_);
      auVar76._4_12_ = auVar61._4_12_;
      auVar76._0_4_ =
           (float)((uint)bVar30 * (int)(auVar38._0_4_ * fVar77) + (uint)!bVar30 * auVar61._0_4_);
      auVar191._4_4_ = fVar114;
      auVar191._0_4_ = fVar114;
      auVar191._8_4_ = fVar114;
      auVar191._12_4_ = fVar114;
      auVar38 = vmulps_avx512vl(auVar191,auVar41);
      auVar199._0_4_ = auVar62._0_4_;
      auVar199._4_4_ = auVar199._0_4_;
      auVar199._8_4_ = auVar199._0_4_;
      auVar199._12_4_ = auVar199._0_4_;
      auVar46 = vfmadd213ps_avx512vl(auVar48,auVar199,auVar38);
      auVar38 = vmulps_avx512vl(auVar191,auVar39);
      auVar38 = vfmadd213ps_fma(auVar42,auVar199,auVar38);
      auVar41 = vmulps_avx512vl(auVar191,auVar40);
      auVar59 = vfmadd213ps_avx512vl(auVar43,auVar199,auVar41);
      auVar41 = vmulps_avx512vl(auVar191,auVar44);
      auVar39 = vfmadd213ps_fma(auVar47,auVar199,auVar41);
      auVar41 = vshufps_avx512vl(auVar46,auVar65,0xe9);
      auVar41 = vblendps_avx(auVar41,auVar38,4);
      auVar40 = vfmadd213ss_fma(auVar73,auVar73,ZEXT416((uint)(auVar74._0_4_ * auVar74._0_4_)));
      auVar40 = vfnmadd231ss_fma(auVar40,auVar75,auVar75);
      auVar48 = vfnmadd231ss_fma(auVar40,auVar76,auVar76);
      auVar40 = vfmadd213ss_fma(auVar75,auVar74,ZEXT416((uint)(auVar73._0_4_ * auVar76._0_4_)));
      fVar114 = auVar40._0_4_ + auVar40._0_4_;
      auVar40 = vfmsub213ss_fma(auVar76,auVar74,ZEXT416((uint)(auVar73._0_4_ * auVar75._0_4_)));
      fVar77 = auVar40._0_4_ + auVar40._0_4_;
      auVar40 = vfmsub231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar76._0_4_)),auVar74,auVar75);
      fVar33 = auVar40._0_4_ + auVar40._0_4_;
      auVar44 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar74._0_4_)),auVar73,auVar73);
      auVar40 = vfmadd213ss_fma(auVar75,auVar75,auVar44);
      auVar43 = vfnmadd231ss_fma(auVar40,auVar76,auVar76);
      auVar40 = vfmadd213ss_fma(auVar76,auVar75,ZEXT416((uint)(auVar73._0_4_ * auVar74._0_4_)));
      fVar138 = auVar40._0_4_ + auVar40._0_4_;
      auVar40 = vfmadd213ss_fma(auVar74,auVar76,ZEXT416((uint)(auVar73._0_4_ * auVar75._0_4_)));
      fVar174 = auVar40._0_4_ + auVar40._0_4_;
      auVar40 = vfmsub231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar74._0_4_)),auVar75,auVar76);
      fVar194 = auVar40._0_4_ + auVar40._0_4_;
      auVar40 = vfnmadd231ss_fma(auVar44,auVar75,auVar75);
      auVar42 = vfmadd231ss_fma(auVar40,auVar76,auVar76);
      uVar154 = auVar48._0_4_;
      auVar135._4_4_ = uVar154;
      auVar135._0_4_ = uVar154;
      auVar135._8_4_ = uVar154;
      auVar135._12_4_ = uVar154;
      auVar149._4_4_ = fVar114;
      auVar149._0_4_ = fVar114;
      auVar149._8_4_ = fVar114;
      auVar149._12_4_ = fVar114;
      auVar218._0_4_ = fVar77 * 0.0;
      auVar218._4_4_ = fVar77 * 0.0;
      auVar218._8_4_ = fVar77 * 1.0;
      auVar218._12_4_ = fVar77 * 0.0;
      auVar47 = ZEXT816(0x3f80000000000000);
      auVar40 = vfmadd231ps_fma(auVar218,auVar47,auVar149);
      auVar60 = SUB6416(ZEXT464(0x3f800000),0);
      auVar44 = vfmadd231ps_fma(auVar40,auVar60,auVar135);
      auVar136._4_4_ = fVar33;
      auVar136._0_4_ = fVar33;
      auVar136._8_4_ = fVar33;
      auVar136._12_4_ = fVar33;
      uVar154 = auVar43._0_4_;
      auVar150._4_4_ = uVar154;
      auVar150._0_4_ = uVar154;
      auVar150._8_4_ = uVar154;
      auVar150._12_4_ = uVar154;
      auVar214._0_4_ = fVar138 * 0.0;
      auVar214._4_4_ = fVar138 * 0.0;
      auVar214._8_4_ = fVar138 * 1.0;
      auVar214._12_4_ = fVar138 * 0.0;
      auVar40 = vfmadd231ps_fma(auVar214,auVar47,auVar150);
      auVar48 = vfmadd231ps_fma(auVar40,auVar60,auVar136);
      auVar137._4_4_ = fVar174;
      auVar137._0_4_ = fVar174;
      auVar137._8_4_ = fVar174;
      auVar137._12_4_ = fVar174;
      auVar151._4_4_ = fVar194;
      auVar151._0_4_ = fVar194;
      auVar151._8_4_ = fVar194;
      auVar151._12_4_ = fVar194;
      fVar114 = auVar42._0_4_;
      auVar161._0_4_ = fVar114 * 0.0;
      auVar161._4_4_ = fVar114 * 0.0;
      auVar161._8_4_ = fVar114 * 1.0;
      auVar161._12_4_ = fVar114 * 0.0;
      auVar40 = vfmadd231ps_fma(auVar161,auVar47,auVar151);
      auVar40 = vfmadd231ps_fma(auVar40,auVar60,auVar137);
      auVar42 = vbroadcastss_avx512vl(auVar46);
      fVar114 = auVar40._0_4_;
      auVar152._0_4_ = fVar114 * 0.0;
      fVar77 = auVar40._4_4_;
      auVar152._4_4_ = fVar77 * 0.0;
      fVar33 = auVar40._8_4_;
      auVar152._8_4_ = fVar33 * 0.0;
      fVar138 = auVar40._12_4_;
      auVar152._12_4_ = fVar138 * 0.0;
      auVar40 = vfmadd213ps_fma(auVar65,auVar48,auVar152);
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar40,auVar44,auVar42);
      uVar154 = auVar38._0_4_;
      auVar192._4_4_ = uVar154;
      auVar192._0_4_ = uVar154;
      auVar192._8_4_ = uVar154;
      auVar192._12_4_ = uVar154;
      auVar38 = vshufps_avx(auVar38,auVar38,0x55);
      auVar38 = vfmadd213ps_fma(auVar38,auVar48,auVar152);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar38,auVar44,auVar192);
      auVar40 = vbroadcastss_avx512vl(auVar59);
      auVar38 = vshufps_avx512vl(auVar59,auVar59,0x55);
      auVar42 = vshufps_avx512vl(auVar59,auVar59,0xaa);
      auVar153._0_4_ = auVar42._0_4_ * fVar114;
      auVar153._4_4_ = auVar42._4_4_ * fVar77;
      auVar153._8_4_ = auVar42._8_4_ * fVar33;
      auVar153._12_4_ = auVar42._12_4_ * fVar138;
      auVar38 = vfmadd231ps_fma(auVar153,auVar48,auVar38);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar38,auVar44,auVar40);
      uVar154 = auVar39._0_4_;
      auVar193._4_4_ = uVar154;
      auVar193._0_4_ = uVar154;
      auVar193._8_4_ = uVar154;
      auVar193._12_4_ = uVar154;
      auVar38 = vshufps_avx(auVar39,auVar39,0x55);
      auVar39 = vshufps_avx(auVar39,auVar39,0xaa);
      auVar162._0_4_ = auVar39._0_4_ * fVar114;
      auVar162._4_4_ = auVar39._4_4_ * fVar77;
      auVar162._8_4_ = auVar39._8_4_ * fVar33;
      auVar162._12_4_ = auVar39._12_4_ * fVar138;
      auVar38 = vfmadd231ps_fma(auVar162,auVar48,auVar38);
      auVar39 = vfmadd231ps_fma(auVar38,auVar44,auVar193);
      auVar38._0_4_ = auVar41._0_4_ + 0.0 + auVar39._0_4_;
      auVar38._4_4_ = auVar41._4_4_ + 0.0 + auVar39._4_4_;
      auVar38._8_4_ = auVar41._8_4_ + 0.0 + auVar39._8_4_;
      auVar38._12_4_ = auVar41._12_4_ + 0.0 + auVar39._12_4_;
    }
    else {
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar22 = *plVar25;
          lVar27 = plVar25[2] * uVar21;
          auVar38 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + lVar27)),
                                  ZEXT416(*(uint *)(lVar22 + 0x10 + lVar27)),0x1c);
          auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(lVar22 + 0x20 + lVar27)),0x28);
          auVar40 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 4 + lVar27)),
                                  ZEXT416(*(uint *)(lVar22 + 0x14 + lVar27)),0x1c);
          auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(lVar22 + 0x24 + lVar27)),0x28);
          auVar44 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 8 + lVar27)),
                                  ZEXT416(*(uint *)(lVar22 + 0x18 + lVar27)),0x1c);
          auVar44 = vinsertps_avx(auVar44,ZEXT416(*(uint *)(lVar22 + 0x28 + lVar27)),0x28);
          auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar22 + 0xc + lVar27)),
                                  ZEXT416(*(uint *)(lVar22 + 0x1c + lVar27)),0x1c);
          auVar46 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(lVar22 + 0x2c + lVar27)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar22 = *plVar25;
          lVar27 = plVar25[2] * uVar21;
          auVar141._8_8_ = 0;
          auVar141._0_8_ = *(ulong *)(lVar22 + 4 + lVar27);
          auVar157._8_8_ = 0;
          auVar157._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar27);
          auVar38 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,auVar141);
          auVar40 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0xc + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,auVar157);
          auVar158._8_8_ = 0;
          auVar158._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar27);
          auVar44 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x18 + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,auVar158);
          b0.field_0._8_8_ = 0;
          b0.field_0._0_8_ = *(ulong *)(lVar22 + 0x28 + lVar27);
          auVar46 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar22 + 0x24 + lVar27)),
                                       (undefined1  [16])_DAT_02060e80,(undefined1  [16])b0.field_0)
          ;
          aVar45 = _DAT_02060e80;
        }
      }
      else if (iVar115 == 0xb001) {
        lVar22 = *plVar25;
        lVar27 = plVar25[2] * uVar21;
        auVar90._8_8_ = 0;
        auVar90._0_8_ = *(ulong *)(lVar22 + 0x10 + lVar27);
        auVar40 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(lVar22 + 8 + lVar27)),0x20);
        auVar91._8_8_ = 0;
        auVar91._0_8_ = *(ulong *)(lVar22 + 0x34 + lVar27);
        uVar26 = *(uint *)(lVar22 + 0xc + lVar27);
        aVar45 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar26);
        auVar44 = vpermt2ps_avx512vl(auVar91,_DAT_02060e90,ZEXT416(*(uint *)(lVar22 + lVar27)));
        auVar181._8_8_ = 0;
        auVar181._0_8_ = *(ulong *)(lVar22 + 0x1c + lVar27);
        fVar77 = *(float *)(lVar22 + 0x24 + lVar27);
        auVar39 = ZEXT416((uint)fVar77);
        fVar33 = *(float *)(lVar22 + 0x28 + lVar27);
        auVar41 = ZEXT416((uint)fVar33);
        fVar138 = *(float *)(lVar22 + 0x2c + lVar27);
        auVar48 = vpermt2ps_avx512vl(auVar181,_DAT_02060e90,
                                     ZEXT416(*(uint *)(lVar22 + 0x18 + lVar27)));
        fVar174 = *(float *)(lVar22 + 0x30 + lVar27);
        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),ZEXT416((uint)fVar77),
                                  ZEXT416((uint)fVar77));
        auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
        auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar174),ZEXT416((uint)fVar174));
        auVar42 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar38._0_4_));
        fVar194 = auVar42._0_4_;
        fVar194 = fVar194 * 1.5 + fVar194 * fVar194 * fVar194 * auVar38._0_4_ * -0.5;
        auVar46 = vinsertps_avx(auVar48,ZEXT416((uint)(fVar194 * fVar77)),0x30);
        auVar38 = vinsertps_avx(auVar44,ZEXT416((uint)(fVar194 * fVar33)),0x30);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     ZEXT416((uint)(fVar138 * fVar194));
        auVar44 = vinsertps_avx(auVar40,ZEXT416((uint)(fVar194 * fVar174)),0x30);
        auVar40 = vinsertps_avx(ZEXT416(uVar26),ZEXT416(*(uint *)(lVar22 + 4 + lVar27)),0x10);
        auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(lVar22 + 0x3c + lVar27)),0x20);
        auVar40 = vinsertps_avx(auVar40,ZEXT416((uint)(fVar138 * fVar194)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar22 = *plVar25;
        lVar27 = plVar25[2] * uVar21;
        auVar38 = *(undefined1 (*) [16])(lVar22 + lVar27);
        auVar40 = *(undefined1 (*) [16])(lVar22 + 0x10 + lVar27);
        auVar44 = *(undefined1 (*) [16])(lVar22 + 0x20 + lVar27);
        auVar46 = *(undefined1 (*) [16])(lVar22 + 0x30 + lVar27);
      }
      lVar22 = (ulong)(iVar23 + 1) * 0x38;
      plVar25 = (long *)(lVar28 + lVar22);
      iVar115 = *(int *)(lVar28 + 0x20 + lVar22);
      if (iVar115 < 0x9244) {
        if (iVar115 == 0x9134) {
          lVar28 = *plVar25;
          lVar22 = uVar21 * plVar25[2];
          auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x10 + lVar22)),0x1c);
          aVar45 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar41,ZEXT416(*(uint *)(lVar28 + 0x20 + lVar22)),0x28);
          auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 4 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x14 + lVar22)),0x1c);
          auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(lVar28 + 0x24 + lVar22)),0x28);
          auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 8 + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)),0x1c);
          auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar28 + 0x28 + lVar22)),0x28);
          auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                  ZEXT416(*(uint *)(lVar28 + 0x1c + lVar22)),0x1c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar48,ZEXT416(*(uint *)(lVar28 + 0x2c + lVar22)),0x28);
        }
        else if (iVar115 == 0x9234) {
          lVar28 = *plVar25;
          lVar22 = uVar21 * plVar25[2];
          auVar182._8_8_ = 0;
          auVar182._0_8_ = *(ulong *)(lVar28 + 4 + lVar22);
          auVar195._8_8_ = 0;
          auVar195._0_8_ = *(ulong *)(lVar28 + 0x10 + lVar22);
          aVar45.v = (__m128)vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + lVar22)),_DAT_02060e80,
                                                auVar182);
          auVar41 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                       (undefined1  [16])_DAT_02060e80,auVar195);
          auVar183._8_8_ = 0;
          auVar183._0_8_ = *(ulong *)(lVar28 + 0x1c + lVar22);
          auVar39 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)),
                                       (undefined1  [16])_DAT_02060e80,auVar183);
          auVar215._8_8_ = 0;
          auVar215._0_8_ = *(ulong *)(lVar28 + 0x28 + lVar22);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar28 + 0x24 + lVar22)),
                                          (undefined1  [16])_DAT_02060e80,auVar215);
        }
      }
      else if (iVar115 == 0xb001) {
        lVar28 = *plVar25;
        lVar22 = uVar21 * plVar25[2];
        auVar163._8_8_ = 0;
        auVar163._0_8_ = *(ulong *)(lVar28 + 0x10 + lVar22);
        auVar41 = vinsertps_avx(auVar163,ZEXT416(*(uint *)(lVar28 + 8 + lVar22)),0x20);
        auVar164._8_8_ = 0;
        auVar164._0_8_ = *(ulong *)(lVar28 + 0x34 + lVar22);
        auVar48 = vpermt2ps_avx512vl(auVar164,_DAT_02060e90,ZEXT416(*(uint *)(lVar28 + lVar22)));
        auVar216._8_8_ = 0;
        auVar216._0_8_ = *(ulong *)(lVar28 + 0x1c + lVar22);
        fVar77 = *(float *)(lVar28 + 0x24 + lVar22);
        fVar33 = *(float *)(lVar28 + 0x28 + lVar22);
        fVar138 = *(float *)(lVar28 + 0x2c + lVar22);
        auVar42 = vpermt2ps_avx512vl(auVar216,_DAT_02060e90,
                                     ZEXT416(*(uint *)(lVar28 + 0x18 + lVar22)));
        fVar174 = *(float *)(lVar28 + 0x30 + lVar22);
        auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar33 * fVar33)),ZEXT416((uint)fVar77),
                                  ZEXT416((uint)fVar77));
        auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
        auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar174),ZEXT416((uint)fVar174));
        auVar225._4_12_ = ZEXT812(0) << 0x20;
        auVar225._0_4_ = auVar39._0_4_;
        auVar43 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar225);
        fVar194 = auVar43._0_4_;
        fVar194 = fVar194 * 1.5 + fVar194 * fVar194 * fVar194 * auVar39._0_4_ * -0.5;
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar42,ZEXT416((uint)(fVar77 * fVar194)),0x30);
        aVar45 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vinsertps_avx(auVar48,ZEXT416((uint)(fVar33 * fVar194)),0x30);
        auVar39 = vinsertps_avx(auVar41,ZEXT416((uint)(fVar194 * fVar174)),0x30);
        auVar41 = vinsertps_avx(ZEXT416(*(uint *)(lVar28 + 0xc + lVar22)),
                                ZEXT416(*(uint *)(lVar28 + 4 + lVar22)),0x10);
        auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(lVar28 + 0x3c + lVar22)),0x20);
        auVar41 = vinsertps_avx(auVar41,ZEXT416((uint)(fVar138 * fVar194)),0x30);
      }
      else if (iVar115 == 0x9244) {
        lVar28 = *plVar25;
        lVar22 = uVar21 * plVar25[2];
        aVar45 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                  ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar28 + lVar22))->v;
        auVar41 = *(undefined1 (*) [16])(lVar28 + 0x10 + lVar22);
        auVar39 = *(undefined1 (*) [16])(lVar28 + 0x20 + lVar22);
        b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar28 + 0x30 + lVar22))->v
        ;
      }
      fVar77 = 1.0 - fVar114;
      auVar165._0_4_ = fVar114 * aVar45.v[0];
      auVar165._4_4_ = fVar114 * aVar45.v[1];
      auVar165._8_4_ = fVar114 * aVar45.v[2];
      auVar165._12_4_ = fVar114 * aVar45.v[3];
      auVar207._4_4_ = fVar77;
      auVar207._0_4_ = fVar77;
      auVar207._8_4_ = fVar77;
      auVar207._12_4_ = fVar77;
      a0_2.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd213ps_fma(auVar38,auVar207,auVar165);
      auVar166._0_4_ = fVar114 * auVar41._0_4_;
      auVar166._4_4_ = fVar114 * auVar41._4_4_;
      auVar166._8_4_ = fVar114 * auVar41._8_4_;
      auVar166._12_4_ = fVar114 * auVar41._12_4_;
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd213ps_fma(auVar40,auVar207,auVar166);
      auVar167._0_4_ = fVar114 * auVar39._0_4_;
      auVar167._4_4_ = fVar114 * auVar39._4_4_;
      auVar167._8_4_ = fVar114 * auVar39._8_4_;
      auVar167._12_4_ = fVar114 * auVar39._12_4_;
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd213ps_fma(auVar44,auVar207,auVar167);
      auVar168._0_4_ = fVar114 * b0.field_0._0_4_;
      auVar168._4_4_ = fVar114 * b0.field_0._4_4_;
      auVar168._8_4_ = fVar114 * b0.field_0._8_4_;
      auVar168._12_4_ = fVar114 * b0.field_0._12_4_;
      auVar38 = vfmadd213ps_fma(auVar46,auVar207,auVar168);
    }
  }
  auVar41 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
  auVar39 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
  auVar196._0_4_ = a0_1.field_0._0_4_ * auVar39._0_4_;
  auVar196._4_4_ = a0_1.field_0._4_4_ * auVar39._4_4_;
  auVar196._8_4_ = a0_1.field_0._8_4_ * auVar39._8_4_;
  auVar196._12_4_ = a0_1.field_0._12_4_ * auVar39._12_4_;
  auVar48 = vfmsub231ps_fma(auVar196,(undefined1  [16])a0.field_0,auVar41);
  auVar40 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar44 = vshufps_avx((undefined1  [16])a0_2.field_0,(undefined1  [16])a0_2.field_0,0xc9);
  auVar169._0_4_ = a0_2.field_0._0_4_ * auVar41._0_4_;
  auVar169._4_4_ = a0_2.field_0._4_4_ * auVar41._4_4_;
  auVar169._8_4_ = a0_2.field_0._8_4_ * auVar41._8_4_;
  auVar169._12_4_ = a0_2.field_0._12_4_ * auVar41._12_4_;
  auVar42 = vfmsub231ps_fma(auVar169,auVar44,(undefined1  [16])a0_1.field_0);
  auVar120._0_4_ = auVar44._0_4_ * a0.field_0._0_4_;
  auVar120._4_4_ = auVar44._4_4_ * a0.field_0._4_4_;
  auVar120._8_4_ = auVar44._8_4_ * a0.field_0._8_4_;
  auVar120._12_4_ = auVar44._12_4_ * a0.field_0._12_4_;
  auVar44 = vfmsub231ps_fma(auVar120,(undefined1  [16])a0_2.field_0,auVar39);
  auVar41 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar39 = vunpcklps_avx(auVar40,auVar41);
  auVar44 = vunpcklps_avx(auVar48,auVar44);
  auVar41 = vinsertps_avx(auVar42,auVar42,0x4a);
  auVar44 = vunpcklps_avx(auVar44,ZEXT416(auVar42._0_4_));
  auVar48 = vunpcklps_avx(auVar39,auVar41);
  auVar39 = vunpckhps_avx(auVar39,auVar41);
  auVar41 = vdpps_avx((undefined1  [16])a0_2.field_0,auVar40,0x7f);
  auVar92._0_4_ = auVar41._0_4_;
  auVar92._4_4_ = auVar92._0_4_;
  auVar92._8_4_ = auVar92._0_4_;
  auVar92._12_4_ = auVar92._0_4_;
  auVar41 = vdivps_avx(auVar48,auVar92);
  auVar39 = vdivps_avx(auVar39,auVar92);
  auVar40 = vdivps_avx(auVar44,auVar92);
  uVar154 = auVar38._0_4_;
  auVar93._4_4_ = uVar154;
  auVar93._0_4_ = uVar154;
  auVar93._8_4_ = uVar154;
  auVar93._12_4_ = uVar154;
  auVar44 = vshufps_avx(auVar38,auVar38,0x55);
  auVar38 = vshufps_avx(auVar38,auVar38,0xaa);
  auVar142._0_4_ = auVar38._0_4_ * auVar40._0_4_;
  auVar142._4_4_ = auVar38._4_4_ * auVar40._4_4_;
  auVar142._8_4_ = auVar38._8_4_ * auVar40._8_4_;
  auVar142._12_4_ = auVar38._12_4_ * auVar40._12_4_;
  auVar38 = vfmadd231ps_fma(auVar142,auVar39,auVar44);
  auVar38 = vfmadd231ps_fma(auVar38,auVar41,auVar93);
  auVar10._8_4_ = 0x80000000;
  auVar10._0_8_ = 0x8000000080000000;
  auVar10._12_4_ = 0x80000000;
  auVar38 = vxorps_avx512vl(auVar38,auVar10);
  if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
    local_90 = 2;
    local_78 = 0.0;
    goto LAB_01fe2e62;
  }
  auVar44 = vdpps_avx(auVar41,auVar39,0x7f);
  auVar11._8_4_ = 0x7fffffff;
  auVar11._0_8_ = 0x7fffffff7fffffff;
  auVar11._12_4_ = 0x7fffffff;
  auVar44 = vandps_avx512vl(auVar44,auVar11);
  local_78 = 0.0;
  if (1e-05 < auVar44._0_4_) {
LAB_01fe2e4a:
    bVar30 = false;
  }
  else {
    auVar44 = vdpps_avx(auVar41,auVar40,0x7f);
    auVar12._8_4_ = 0x7fffffff;
    auVar12._0_8_ = 0x7fffffff7fffffff;
    auVar12._12_4_ = 0x7fffffff;
    auVar44 = vandps_avx512vl(auVar44,auVar12);
    if (1e-05 < auVar44._0_4_) goto LAB_01fe2e4a;
    auVar44 = vdpps_avx(auVar39,auVar40,0x7f);
    auVar13._8_4_ = 0x7fffffff;
    auVar13._0_8_ = 0x7fffffff7fffffff;
    auVar13._12_4_ = 0x7fffffff;
    auVar44 = vandps_avx512vl(auVar44,auVar13);
    if (1e-05 < auVar44._0_4_) goto LAB_01fe2e4a;
    auVar48 = vdpps_avx(auVar41,auVar41,0x7f);
    auVar42 = vdpps_avx(auVar39,auVar39,0x7f);
    fVar114 = auVar48._0_4_;
    auVar170._8_4_ = 0x7fffffff;
    auVar170._0_8_ = 0x7fffffff7fffffff;
    auVar170._12_4_ = 0x7fffffff;
    auVar44 = vandps_avx(ZEXT416((uint)(fVar114 - auVar42._0_4_)),auVar170);
    bVar30 = false;
    if (auVar44._0_4_ <= 1e-05) {
      auVar43 = vdpps_avx(auVar40,auVar40,0x7f);
      auVar44 = vandps_avx(ZEXT416((uint)(fVar114 - auVar43._0_4_)),auVar170);
      bVar30 = false;
      if (auVar44._0_4_ <= 1e-05) {
        auVar17._8_4_ = 0x7fffffff;
        auVar17._0_8_ = 0x7fffffff7fffffff;
        auVar17._12_4_ = 0x7fffffff;
        auVar44 = vandps_avx512vl(ZEXT416((uint)(auVar42._0_4_ - auVar43._0_4_)),auVar17);
        bVar30 = auVar44._0_4_ <= 1e-05;
        if (auVar44._0_4_ <= 1e-05) {
          bVar30 = true;
          if (fVar114 < 0.0) {
            local_78 = sqrtf(fVar114);
          }
          else {
            auVar44 = vsqrtss_avx(auVar48,auVar48);
            local_78 = auVar44._0_4_;
          }
        }
      }
    }
  }
  local_90 = 2 - (uint)bVar30;
LAB_01fe2e62:
  pRVar3 = context->userContext;
  uVar26 = pRVar3->instStackSize;
  auVar121._8_8_ = 0;
  auVar121._0_4_ = prim->primID_;
  auVar121._4_4_ = prim->instID_;
  auVar44 = vprolq_avx512vl(auVar121,0x20);
  *(long *)(pRVar3->instID + uVar26) = auVar44._0_8_;
  *(undefined1 (*) [16])pRVar3->world2inst[uVar26] = auVar41;
  *(undefined1 (*) [16])(pRVar3->world2inst[uVar26] + 4) = auVar39;
  *(undefined1 (*) [16])(pRVar3->world2inst[uVar26] + 8) = auVar40;
  *(undefined1 (*) [16])(pRVar3->world2inst[uVar26] + 0xc) = auVar38;
  *(undefined1 (*) [16])pRVar3->inst2world[uVar26] = auVar34;
  *(undefined1 (*) [16])(pRVar3->inst2world[uVar26] + 4) = auVar35;
  *(undefined1 (*) [16])(pRVar3->inst2world[uVar26] + 8) = auVar36;
  *(undefined1 (*) [16])(pRVar3->inst2world[uVar26] + 0xc) = auVar37;
  pRVar3->instStackSize = pRVar3->instStackSize + 1;
  local_dc = query->time;
  uVar154 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  auVar14._4_4_ = uVar154;
  auVar14._0_4_ = uVar154;
  auVar14._8_4_ = uVar154;
  auVar14._12_4_ = uVar154;
  auVar34 = vfmadd132ps_avx512vl(auVar40,auVar38,auVar14);
  uVar154 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  auVar15._4_4_ = uVar154;
  auVar15._0_4_ = uVar154;
  auVar15._8_4_ = uVar154;
  auVar15._12_4_ = uVar154;
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar39,auVar15);
  uVar154 = *(undefined4 *)&(query->p).field_0;
  auVar16._4_4_ = uVar154;
  auVar16._0_4_ = uVar154;
  auVar16._8_4_ = uVar154;
  auVar16._12_4_ = uVar154;
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar41,auVar16);
  local_e8 = vmovlps_avx(auVar34);
  local_e0 = vextractps_avx(auVar34,2);
  local_d8 = local_78 * query->radius;
  local_98 = context->query_ws;
  local_70 = context->userPtr;
  local_a0 = 0;
  local_88._0_8_ = context->func;
  local_88._8_8_ = context->userContext;
  local_68 = 0xffffffffffffffff;
  local_58._4_4_ = local_98->radius;
  local_58._0_4_ = local_58._4_4_;
  fStack_50 = (float)local_58._4_4_;
  fStack_4c = (float)local_58._4_4_;
  fVar114 = local_98->radius;
  local_a8 = p_Var29;
  if (local_90 == 2) {
    if ((INFINITY <= fVar114) || (lVar28 = vpextrq_avx(local_88,1), *(int *)(lVar28 + 0x88) == 0)) {
      local_48._4_4_ = fVar114;
      local_48._0_4_ = fVar114;
      local_48._8_4_ = fVar114;
      local_48._12_4_ = fVar114;
    }
    else {
      pointQuery();
    }
  }
  else {
    fVar114 = local_78 * fVar114;
    local_48._4_4_ = fVar114;
    local_48._0_4_ = fVar114;
    local_48._8_4_ = fVar114;
    local_48._12_4_ = fVar114;
  }
  _local_58 = local_48;
  uVar19 = (**(code **)(p_Var29 + 0x88))(p_Var29 + 0x58,&local_e8);
  pRVar3 = context->userContext;
  uVar26 = pRVar3->instStackSize - 1;
  pRVar3->instStackSize = uVar26;
  pRVar3->instID[uVar26] = 0xffffffff;
  pRVar3->instPrimID[pRVar3->instStackSize] = 0xffffffff;
  return (bool)uVar19;
}

Assistant:

bool InstanceArrayIntersector1MB::pointQuery(PointQuery* query, PointQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      const AffineSpace3fa local2world = instance->getLocal2World(prim.primID_, query->time);
      const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, query->time);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, prim.primID_, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func, 
          context->userContext,
          similarityScale,
          context->userPtr); 

        bool changed = object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }